

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EB2_Level.H
# Opt level: O1

void __thiscall
amrex::EB2::
GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::UnionIF<amrex::EB2::LatheIF<amrex::EB2::SplineIF>,_amrex::EB2::CylinderIF>,_int>_>
::define_fine(GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::UnionIF<amrex::EB2::LatheIF<amrex::EB2::SplineIF>,_amrex::EB2::CylinderIF>,_int>_>
              *this,GeometryShop<amrex::EB2::UnionIF<amrex::EB2::LatheIF<amrex::EB2::SplineIF>,_amrex::EB2::CylinderIF>,_int>
                    *gshop,Geometry *geom,int max_grid_size,int ngrow,bool extend_domain_face,
             int num_crse_opt)

{
  Box *pBVar1;
  BoxArray *this_00;
  DistributionMapping *dm;
  FabArray<amrex::EBCellFlagFab> *this_01;
  MultiFab *this_02;
  MultiFab *this_03;
  MultiFab *this_04;
  int *piVar2;
  GFab *this_05;
  IntVect *pIVar3;
  iterator *piVar4;
  undefined8 uVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var6;
  pointer pGVar7;
  char cVar8;
  bool bVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  void *pvVar12;
  size_type sVar13;
  Level *pLVar14;
  Level *pLVar15;
  Level *pLVar16;
  Level *pLVar17;
  Level *pLVar18;
  Level *pLVar19;
  Level *pLVar20;
  Level *pLVar21;
  Level *pLVar22;
  FabArray<amrex::FArrayBox> *this_06;
  Geometry *pGVar23;
  int iVar24;
  int iVar25;
  _Map_pointer ppbVar26;
  size_t sVar27;
  bool bVar28;
  int idim;
  int iVar29;
  int iVar30;
  int iVar31;
  int iVar32;
  long lVar33;
  Box *pBVar34;
  long lVar35;
  int *piVar36;
  Arena *arena;
  pointer pBVar37;
  pointer pBVar38;
  _Elt_pointer *ppbVar39;
  Geometry *__src;
  FabArray<amrex::FArrayBox> *pFVar40;
  Array4<const_unsigned_int> *type;
  ulong uVar41;
  long *plVar42;
  BaseFab<double> *this_07;
  undefined7 in_register_00000089;
  int iVar43;
  IntVect *domlo;
  int idim_4;
  GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::UnionIF<amrex::EB2::LatheIF<amrex::EB2::SplineIF>,_amrex::EB2::CylinderIF>,_int>_>
  *pGVar44;
  long lVar45;
  double dVar46;
  uint uVar47;
  uint uVar48;
  initializer_list<std::reference_wrapper<int>_> __l;
  Periodicity PVar49;
  bool cover_multiple_cuts;
  GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::UnionIF<amrex::EB2::LatheIF<amrex::EB2::SplineIF>,_amrex::EB2::CylinderIF>,_int>_>
  *local_ef0;
  int nmulticuts;
  int nsmallcells;
  int maxiter;
  undefined4 local_ed8;
  int nmc;
  FabArray<amrex::FArrayBox> *local_ed0;
  undefined8 local_ec8;
  undefined8 uStack_ec0;
  Geometry *local_eb8;
  int nsm;
  Box lhs;
  int local_e88 [2];
  int local_e80;
  Vector<int,_std::allocator<int>_> *local_e68;
  FabArrayBase *local_e40;
  FabArray<amrex::FArrayBox> *local_e38;
  FabArray<amrex::FArrayBox> *local_e30;
  BoxList cut_boxes;
  IntVect crse_ratio;
  undefined4 uStack_dfc;
  BoxList covered_boxes;
  Box result;
  _Rb_tree<amrex::Box,_std::pair<const_amrex::Box,_amrex::EBCellFlagFab::NumCells>,_std::_Select1st<std::pair<const_amrex::Box,_amrex::EBCellFlagFab::NumCells>_>,_std::less<amrex::Box>,_std::allocator<std::pair<const_amrex::Box,_amrex::EBCellFlagFab::NumCells>_>_>
  local_d50;
  Box bounding_box;
  Real small_volfrac;
  Array4<double> local_cc8;
  ParmParse pp;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_c30;
  int local_c28;
  int local_c24;
  int local_c20;
  int local_c1c;
  int local_c18;
  int local_c14;
  double *local_be8;
  float local_be0;
  Box local_bdc [8];
  Array4<const_unsigned_int> local_af8;
  Array4<const_unsigned_int> local_ab8;
  Array4<const_unsigned_int> local_a78;
  Box bx;
  undefined4 uStack_a1c;
  MFInfo mf_info;
  Array4<amrex::EBCellFlag> local_8e8;
  Array4<double> local_8a8;
  Array4<double> local_868;
  undefined1 local_828 [40];
  int iStack_800;
  int iStack_7f4;
  int iStack_7f0;
  Array4<double> local_7e8;
  Array4<amrex::EBCellFlag> local_7a8;
  Array4<const_double> local_768;
  IntVect edge_type;
  undefined4 uStack_71c;
  undefined1 local_718 [64];
  element_type *local_6d8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_6d0;
  element_type *peStack_6c8;
  double *local_6a8;
  pointer piStack_6a0;
  pointer local_698;
  _Bit_type *p_Stack_690;
  Dim3 aDStack_688 [18];
  Box local_5a8;
  undefined1 local_588 [32];
  Dim3 local_568;
  Dim3 local_55c;
  int local_550;
  Array4<unsigned_int> local_548;
  Array4<unsigned_int> local_508;
  Array4<unsigned_int> local_4c8;
  GpuArray<double,_3U> local_488;
  GpuArray<double,_3U> local_468;
  Box local_448;
  vector<std::reference_wrapper<int>,_std::allocator<std::reference_wrapper<int>_>_> local_420;
  Array4<double> local_408;
  Array4<double> local_3c8;
  Array4<double> local_388;
  Array4<const_double> local_348;
  Array4<const_double> local_308;
  Array4<const_double> local_2c8;
  Array4<const_double> local_288;
  Array4<double> local_248;
  Array4<double> local_208;
  Array4<double> local_1c8;
  Elixir cellflagtmp_eli;
  Array4<double> local_170;
  Array4<double> local_130;
  Array4<double> local_f0;
  Array4<double> local_b0;
  Array4<double> local_70;
  
  local_e38 = (FabArray<amrex::FArrayBox> *)CONCAT44(local_e38._4_4_,max_grid_size);
  local_ed0 = (FabArray<amrex::FArrayBox> *)gshop;
  local_eb8 = geom;
  iVar29 = Verbose();
  local_ed8 = (undefined4)CONCAT71(in_register_00000089,extend_domain_face);
  local_ef0 = this;
  if (0 < iVar29 && !extend_domain_face) {
    pp.m_pstack.c.
    super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Deque_impl_data._M_map_size = (size_t)OutStream();
    piVar4 = &pp.m_pstack.c.
              super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Deque_impl_data._M_start;
    pp.m_pstack.c.
    super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Deque_impl_data._M_map._4_4_ = *(undefined4 *)(DAT_00756620 + -0x48);
    pp.m_pstack.c.
    super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Deque_impl_data._M_map._0_4_ = *(undefined4 *)(DAT_00756620 + -0x30);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)piVar4);
    *(undefined8 *)
     ((long)&pp.m_pstack.c.
             super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_first +
     pp.m_pstack.c.
     super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
     ._M_impl.super__Deque_impl_data._M_start._M_cur[-1]._M_string_length) =
         *(undefined8 *)
          (pp.m_pstack.c.
           super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Deque_impl_data._M_map_size + 8 +
          *(long *)(*(long *)pp.m_pstack.c.
                             super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Deque_impl_data._M_map_size + -0x18));
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)piVar4,"AMReX WARNING: extend_domain_face=false is not recommended!\n",
               0x3c);
    Print::~Print((Print *)&pp);
  }
  pGVar44 = local_ef0;
  small_volfrac = 1e-14;
  cover_multiple_cuts = false;
  maxiter = 0x20;
  edge_type.vect._0_8_ = local_718;
  std::__cxx11::string::_M_construct<char_const*>((string *)&edge_type,"eb2","");
  ParmParse::ParmParse(&pp,(string *)&edge_type);
  if ((undefined1 *)edge_type.vect._0_8_ != local_718) {
    operator_delete((void *)edge_type.vect._0_8_,local_718._0_8_ + 1);
  }
  ParmParse::queryAdd<double,_0>(&pp,"small_volfrac",&small_volfrac);
  ParmParse::queryAdd<bool,_0>(&pp,"cover_multiple_cuts",&cover_multiple_cuts);
  ParmParse::queryAdd<int,_0>(&pp,"maxiter",&maxiter);
  std::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~deque((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&pp);
  dVar46 = ceil((double)ngrow * 0.0625);
  pGVar23 = local_eb8;
  iVar29 = (int)dVar46 << 4;
  (pGVar44->super_Level).m_ngrow.vect[0] = iVar29;
  (pGVar44->super_Level).m_ngrow.vect[1] = iVar29;
  (pGVar44->super_Level).m_ngrow.vect[2] = iVar29;
  pBVar1 = &local_eb8->domain;
  uVar5 = *(undefined8 *)(local_eb8->domain).smallend.vect;
  uVar10 = *(undefined8 *)((local_eb8->domain).smallend.vect + 2);
  uVar11 = *(undefined8 *)((local_eb8->domain).bigend.vect + 2);
  local_5a8.bigend.vect[1] = (int)((ulong)*(undefined8 *)(local_eb8->domain).bigend.vect >> 0x20);
  local_5a8.bigend.vect[2] = (int)uVar11;
  local_5a8.btype.itype = (uint)((ulong)uVar11 >> 0x20);
  local_5a8.smallend.vect[0] = (int)uVar5;
  local_5a8.smallend.vect[1] = SUB84(uVar5,4);
  local_5a8.smallend.vect[2] = (int)uVar10;
  local_5a8.bigend.vect[0] = (int)((ulong)uVar10 >> 0x20);
  lVar33 = 0;
  do {
    iVar29 = 0;
    if (*(char *)((long)(local_eb8->super_CoordSys).inv_dx + lVar33 + 0x19) == '\0') {
      iVar29 = (local_5a8.bigend.vect[lVar33] - local_5a8.smallend.vect[lVar33]) + 1;
      iVar43 = (pGVar44->super_Level).m_ngrow.vect[lVar33];
      if (iVar43 <= iVar29) {
        iVar29 = iVar43;
      }
    }
    (pGVar44->super_Level).m_ngrow.vect[lVar33] = iVar29;
    lVar33 = lVar33 + 1;
  } while (lVar33 != 3);
  iVar29 = (pGVar44->super_Level).m_ngrow.vect[0];
  local_5a8.smallend.vect[0] = (int)uVar5;
  local_5a8.smallend.vect[1] = SUB84(uVar5,4);
  iVar43 = (pGVar44->super_Level).m_ngrow.vect[1];
  iVar30 = (pGVar44->super_Level).m_ngrow.vect[2];
  local_5a8.smallend.vect[1] = local_5a8.smallend.vect[1] - iVar43;
  local_5a8.smallend.vect[0] = local_5a8.smallend.vect[0] - iVar29;
  local_5a8.smallend.vect[2] = local_5a8.smallend.vect[2] - iVar30;
  local_5a8.bigend.vect[0] = iVar29 + local_5a8.bigend.vect[0];
  local_5a8.bigend.vect[1] = local_5a8.bigend.vect[1] + iVar43;
  local_5a8.bigend.vect[2] = local_5a8.bigend.vect[2] + iVar30;
  pBVar34 = &local_5a8;
  if ((char)local_ed8 != '\0') {
    pBVar34 = pBVar1;
  }
  uVar5 = *(undefined8 *)((pBVar34->smallend).vect + 2);
  bounding_box.btype.itype = (pBVar34->btype).itype;
  bounding_box.bigend.vect[1] = (pBVar34->bigend).vect[1];
  bounding_box.bigend.vect[2] = (pBVar34->bigend).vect[2];
  bounding_box.smallend.vect._0_8_ = *(undefined8 *)(pBVar34->smallend).vect;
  bounding_box.smallend.vect[2] = (int)uVar5;
  bounding_box.bigend.vect[0] = (int)((ulong)uVar5 >> 0x20);
  lVar33 = 0;
  do {
    if ((bounding_box.btype.itype >> ((uint)lVar33 & 0x1f) & 1) == 0) {
      piVar36 = bounding_box.bigend.vect + lVar33;
      *piVar36 = *piVar36 + 1;
    }
    lVar33 = lVar33 + 1;
  } while (lVar33 != 3);
  bounding_box.btype.itype = 7;
  BoxList::BoxList(&cut_boxes);
  BoxList::BoxList(&covered_boxes);
  iVar29 = *(int *)(ParallelContext::frames + 0x10);
  local_e30 = (FabArray<amrex::FArrayBox> *)(long)*(int *)(ParallelContext::frames + 0xc);
  iVar43 = 8;
  if (num_crse_opt < 8) {
    iVar43 = num_crse_opt;
  }
  __src = pGVar23;
  if (iVar43 < 1) {
    iVar43 = 0;
  }
  do {
    crse_ratio.vect[1] = 1 << ((byte)iVar43 & 0x1f);
    crse_ratio.vect[0] = crse_ratio.vect[1];
    stack0xfffffffffffff200 = CONCAT44(uStack_dfc,crse_ratio.vect[1]);
    pp.m_pstack.c.
    super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Deque_impl_data._M_map_size._0_4_ = 1;
    pp.m_pstack.c.
    super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x100000001;
    bVar28 = Box::coarsenable(pBVar1,&crse_ratio,(IntVect *)&pp);
    if (bVar28) {
      result.bigend.vect[1] = bounding_box.bigend.vect[1];
      result.bigend.vect[2] = bounding_box.bigend.vect[2];
      result.btype = bounding_box.btype;
      result.smallend.vect[0] = bounding_box.smallend.vect[0];
      result.smallend.vect[1] = bounding_box.smallend.vect[1];
      result.smallend.vect[2] = bounding_box.smallend.vect[2];
      result.bigend.vect[0] = bounding_box.bigend.vect[0];
      if (((crse_ratio.vect[0] != 1) || (crse_ratio.vect[1] != 1)) || (crse_ratio.vect[2] != 1)) {
        result.smallend.vect[0] = bounding_box.smallend.vect[0];
        if (crse_ratio.vect[0] != 1) {
          if (crse_ratio.vect[0] == 4) {
            if (result.smallend.vect[0] < 0) {
              uVar48 = result.smallend.vect[0] + 1;
              uVar47 = -uVar48;
              if (0 < (int)uVar48) {
                uVar47 = uVar48;
              }
              uVar47 = uVar47 >> 2;
LAB_0023e9bd:
              result.smallend.vect[0] = ~uVar47;
            }
            else {
              result.smallend.vect[0] = (uint)result.smallend.vect[0] >> 2;
            }
          }
          else if (crse_ratio.vect[0] == 2) {
            if (result.smallend.vect[0] < 0) {
              uVar48 = result.smallend.vect[0] + 1;
              uVar47 = -uVar48;
              if (0 < (int)uVar48) {
                uVar47 = uVar48;
              }
              uVar47 = uVar47 >> 1;
              goto LAB_0023e9bd;
            }
            result.smallend.vect[0] = (uint)result.smallend.vect[0] >> 1;
          }
          else if (result.smallend.vect[0] < 0) {
            iVar31 = result.smallend.vect[0] + 1;
            iVar30 = -iVar31;
            if (0 < iVar31) {
              iVar30 = iVar31;
            }
            result.smallend.vect[0] = ~(iVar30 / crse_ratio.vect[0]);
          }
          else {
            result.smallend.vect[0] = result.smallend.vect[0] / crse_ratio.vect[0];
          }
        }
        result.smallend.vect[1] = bounding_box.smallend.vect[1];
        if (crse_ratio.vect[1] != 1) {
          if (crse_ratio.vect[1] == 4) {
            if ((long)bounding_box.smallend.vect._0_8_ < 0) {
              uVar48 = result.smallend.vect[1] + 1;
              uVar47 = -uVar48;
              if (0 < (int)uVar48) {
                uVar47 = uVar48;
              }
              uVar47 = uVar47 >> 2;
LAB_0023ea23:
              result.smallend.vect[1] = ~uVar47;
            }
            else {
              result.smallend.vect[1] = (uint)result.smallend.vect[1] >> 2;
            }
          }
          else if (crse_ratio.vect[1] == 2) {
            if ((long)bounding_box.smallend.vect._0_8_ < 0) {
              uVar48 = result.smallend.vect[1] + 1;
              uVar47 = -uVar48;
              if (0 < (int)uVar48) {
                uVar47 = uVar48;
              }
              uVar47 = uVar47 >> 1;
              goto LAB_0023ea23;
            }
            result.smallend.vect[1] = (uint)result.smallend.vect[1] >> 1;
          }
          else if ((long)bounding_box.smallend.vect._0_8_ < 0) {
            iVar31 = result.smallend.vect[1] + 1;
            iVar30 = -iVar31;
            if (0 < iVar31) {
              iVar30 = iVar31;
            }
            result.smallend.vect[1] = ~(iVar30 / crse_ratio.vect[1]);
          }
          else {
            result.smallend.vect[1] = result.smallend.vect[1] / crse_ratio.vect[1];
          }
        }
        if (crse_ratio.vect[2] != 1) {
          if (crse_ratio.vect[2] == 4) {
            if (bounding_box.smallend.vect[2] < 0) {
              uVar48 = bounding_box.smallend.vect[2] + 1;
              uVar47 = -uVar48;
              if (0 < (int)uVar48) {
                uVar47 = uVar48;
              }
              uVar47 = uVar47 >> 2;
LAB_0023ea95:
              result.smallend.vect[2] = ~uVar47;
            }
            else {
              result.smallend.vect[2] = (uint)bounding_box.smallend.vect[2] >> 2;
            }
          }
          else if (crse_ratio.vect[2] == 2) {
            if (bounding_box.smallend.vect[2] < 0) {
              uVar48 = bounding_box.smallend.vect[2] + 1;
              uVar47 = -uVar48;
              if (0 < (int)uVar48) {
                uVar47 = uVar48;
              }
              uVar47 = uVar47 >> 1;
              goto LAB_0023ea95;
            }
            result.smallend.vect[2] = (uint)bounding_box.smallend.vect[2] >> 1;
          }
          else if (bounding_box.smallend.vect[2] < 0) {
            iVar31 = bounding_box.smallend.vect[2] + 1;
            iVar30 = -iVar31;
            if (0 < iVar31) {
              iVar30 = iVar31;
            }
            result.smallend.vect[2] = ~(iVar30 / crse_ratio.vect[2]);
          }
          else {
            result.smallend.vect[2] = bounding_box.smallend.vect[2] / crse_ratio.vect[2];
          }
        }
        if (bounding_box.btype.itype == 0) {
          if (crse_ratio.vect[0] != 1) {
            if (crse_ratio.vect[0] == 4) {
              if (bounding_box.bigend.vect[0] < 0) {
                uVar48 = bounding_box.bigend.vect[0] + 1;
                uVar47 = -uVar48;
                if (0 < (int)uVar48) {
                  uVar47 = uVar48;
                }
                uVar47 = uVar47 >> 2;
LAB_0023f236:
                result.bigend.vect[0] = ~uVar47;
              }
              else {
                result.bigend.vect[0] = (uint)bounding_box.bigend.vect[0] >> 2;
              }
            }
            else if (crse_ratio.vect[0] == 2) {
              if (bounding_box.bigend.vect[0] < 0) {
                uVar48 = bounding_box.bigend.vect[0] + 1;
                uVar47 = -uVar48;
                if (0 < (int)uVar48) {
                  uVar47 = uVar48;
                }
                uVar47 = uVar47 >> 1;
                goto LAB_0023f236;
              }
              result.bigend.vect[0] = (uint)bounding_box.bigend.vect[0] >> 1;
            }
            else if (bounding_box.bigend.vect[0] < 0) {
              iVar31 = bounding_box.bigend.vect[0] + 1;
              iVar30 = -iVar31;
              if (0 < iVar31) {
                iVar30 = iVar31;
              }
              result.bigend.vect[0] = ~(iVar30 / crse_ratio.vect[0]);
            }
            else {
              result.bigend.vect[0] = bounding_box.bigend.vect[0] / crse_ratio.vect[0];
            }
          }
          if (crse_ratio.vect[1] != 1) {
            if (crse_ratio.vect[1] == 4) {
              if (bounding_box.bigend.vect[1] < 0) {
                uVar48 = bounding_box.bigend.vect[1] + 1;
                uVar47 = -uVar48;
                if (0 < (int)uVar48) {
                  uVar47 = uVar48;
                }
                uVar47 = uVar47 >> 2;
LAB_0023f29c:
                result.bigend.vect[1] = ~uVar47;
              }
              else {
                result.bigend.vect[1] = (uint)bounding_box.bigend.vect[1] >> 2;
              }
            }
            else if (crse_ratio.vect[1] == 2) {
              if (bounding_box.bigend.vect[1] < 0) {
                uVar48 = bounding_box.bigend.vect[1] + 1;
                uVar47 = -uVar48;
                if (0 < (int)uVar48) {
                  uVar47 = uVar48;
                }
                uVar47 = uVar47 >> 1;
                goto LAB_0023f29c;
              }
              result.bigend.vect[1] = (uint)bounding_box.bigend.vect[1] >> 1;
            }
            else if (bounding_box.bigend.vect[1] < 0) {
              iVar31 = bounding_box.bigend.vect[1] + 1;
              iVar30 = -iVar31;
              if (0 < iVar31) {
                iVar30 = iVar31;
              }
              result.bigend.vect[1] = ~(iVar30 / crse_ratio.vect[1]);
            }
            else {
              result.bigend.vect[1] = bounding_box.bigend.vect[1] / crse_ratio.vect[1];
            }
          }
          if (crse_ratio.vect[2] != 1) {
            if (crse_ratio.vect[2] == 4) {
              if (bounding_box.bigend.vect[2] < 0) {
                uVar48 = bounding_box.bigend.vect[2] + 1;
                uVar47 = -uVar48;
                if (0 < (int)uVar48) {
                  uVar47 = uVar48;
                }
                uVar47 = uVar47 >> 2;
LAB_0023f313:
                result.bigend.vect[2] = ~uVar47;
              }
              else {
                result.bigend.vect[2] = (uint)bounding_box.bigend.vect[2] >> 2;
              }
            }
            else if (crse_ratio.vect[2] == 2) {
              if (bounding_box.bigend.vect[2] < 0) {
                uVar48 = bounding_box.bigend.vect[2] + 1;
                uVar47 = -uVar48;
                if (0 < (int)uVar48) {
                  uVar47 = uVar48;
                }
                uVar47 = uVar47 >> 1;
                goto LAB_0023f313;
              }
              result.bigend.vect[2] = (uint)bounding_box.bigend.vect[2] >> 1;
            }
            else if (bounding_box.bigend.vect[2] < 0) {
              iVar31 = bounding_box.bigend.vect[2] + 1;
              iVar30 = -iVar31;
              if (0 < iVar31) {
                iVar30 = iVar31;
              }
              result.bigend.vect[2] = ~(iVar30 / crse_ratio.vect[2]);
            }
            else {
              result.bigend.vect[2] = bounding_box.bigend.vect[2] / crse_ratio.vect[2];
            }
          }
        }
        else {
          pp.m_pstack.c.
          super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Deque_impl_data._0_12_ = ZEXT812(0);
          lVar33 = 0;
          do {
            if (((bounding_box.btype.itype >> ((uint)lVar33 & 0x1f) & 1) != 0) &&
               (result.bigend.vect[lVar33] % crse_ratio.vect[lVar33] != 0)) {
              *(undefined4 *)
               ((long)&pp.m_pstack.c.
                       super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Deque_impl_data._M_map + lVar33 * 4) = 1;
            }
            lVar33 = lVar33 + 1;
          } while (lVar33 != 3);
          if (crse_ratio.vect[0] != 1) {
            if (crse_ratio.vect[0] == 4) {
              if (bounding_box.bigend.vect[0] < 0) {
                uVar48 = bounding_box.bigend.vect[0] + 1;
                uVar47 = -uVar48;
                if (0 < (int)uVar48) {
                  uVar47 = uVar48;
                }
                uVar47 = uVar47 >> 2;
LAB_0023eba3:
                result.bigend.vect[0] = ~uVar47;
              }
              else {
                result.bigend.vect[0] = (uint)bounding_box.bigend.vect[0] >> 2;
              }
            }
            else if (crse_ratio.vect[0] == 2) {
              if (bounding_box.bigend.vect[0] < 0) {
                uVar48 = bounding_box.bigend.vect[0] + 1;
                uVar47 = -uVar48;
                if (0 < (int)uVar48) {
                  uVar47 = uVar48;
                }
                uVar47 = uVar47 >> 1;
                goto LAB_0023eba3;
              }
              result.bigend.vect[0] = (uint)bounding_box.bigend.vect[0] >> 1;
            }
            else if (bounding_box.bigend.vect[0] < 0) {
              iVar31 = bounding_box.bigend.vect[0] + 1;
              iVar30 = -iVar31;
              if (0 < iVar31) {
                iVar30 = iVar31;
              }
              result.bigend.vect[0] = ~(iVar30 / crse_ratio.vect[0]);
            }
            else {
              result.bigend.vect[0] = bounding_box.bigend.vect[0] / crse_ratio.vect[0];
            }
          }
          if (crse_ratio.vect[1] != 1) {
            if (crse_ratio.vect[1] == 4) {
              if (bounding_box.bigend.vect[1] < 0) {
                uVar48 = bounding_box.bigend.vect[1] + 1;
                uVar47 = -uVar48;
                if (0 < (int)uVar48) {
                  uVar47 = uVar48;
                }
                uVar47 = uVar47 >> 2;
LAB_0023ec0b:
                result.bigend.vect[1] = ~uVar47;
              }
              else {
                result.bigend.vect[1] = (uint)bounding_box.bigend.vect[1] >> 2;
              }
            }
            else if (crse_ratio.vect[1] == 2) {
              if (bounding_box.bigend.vect[1] < 0) {
                uVar48 = bounding_box.bigend.vect[1] + 1;
                uVar47 = -uVar48;
                if (0 < (int)uVar48) {
                  uVar47 = uVar48;
                }
                uVar47 = uVar47 >> 1;
                goto LAB_0023ec0b;
              }
              result.bigend.vect[1] = (uint)bounding_box.bigend.vect[1] >> 1;
            }
            else if (bounding_box.bigend.vect[1] < 0) {
              iVar31 = bounding_box.bigend.vect[1] + 1;
              iVar30 = -iVar31;
              if (0 < iVar31) {
                iVar30 = iVar31;
              }
              result.bigend.vect[1] = ~(iVar30 / crse_ratio.vect[1]);
            }
            else {
              result.bigend.vect[1] = bounding_box.bigend.vect[1] / crse_ratio.vect[1];
            }
          }
          if (crse_ratio.vect[2] != 1) {
            if (crse_ratio.vect[2] == 4) {
              if (bounding_box.bigend.vect[2] < 0) {
                uVar48 = bounding_box.bigend.vect[2] + 1;
                uVar47 = -uVar48;
                if (0 < (int)uVar48) {
                  uVar47 = uVar48;
                }
                uVar47 = uVar47 >> 2;
LAB_0023ec75:
                result.bigend.vect[2] = ~uVar47;
              }
              else {
                result.bigend.vect[2] = (uint)bounding_box.bigend.vect[2] >> 2;
              }
            }
            else if (crse_ratio.vect[2] == 2) {
              if (bounding_box.bigend.vect[2] < 0) {
                uVar48 = bounding_box.bigend.vect[2] + 1;
                uVar47 = -uVar48;
                if (0 < (int)uVar48) {
                  uVar47 = uVar48;
                }
                uVar47 = uVar47 >> 1;
                goto LAB_0023ec75;
              }
              result.bigend.vect[2] = (uint)bounding_box.bigend.vect[2] >> 1;
            }
            else if (bounding_box.bigend.vect[2] < 0) {
              iVar31 = bounding_box.bigend.vect[2] + 1;
              iVar30 = -iVar31;
              if (0 < iVar31) {
                iVar30 = iVar31;
              }
              result.bigend.vect[2] = ~(iVar30 / crse_ratio.vect[2]);
            }
            else {
              result.bigend.vect[2] = bounding_box.bigend.vect[2] / crse_ratio.vect[2];
            }
          }
          result.bigend.vect[0] =
               result.bigend.vect[0] +
               (int)pp.m_pstack.c.
                    super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Deque_impl_data._M_map;
          result.bigend.vect[1] =
               result.bigend.vect[1] +
               pp.m_pstack.c.
               super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Deque_impl_data._M_map._4_4_;
          result.bigend.vect[2] =
               result.bigend.vect[2] +
               (int)pp.m_pstack.c.
                    super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Deque_impl_data._M_map_size;
        }
      }
      memcpy((Geometry *)&pp,__src,200);
      Geometry::coarsen((Geometry *)&pp,&crse_ratio);
      BoxList::BoxList((BoxList *)&edge_type);
      if (cut_boxes.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
          super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
          super__Vector_impl_data._M_start ==
          cut_boxes.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
          super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        BoxList::clear(&covered_boxes);
        BoxList::BoxList((BoxList *)&bx,local_bdc);
        uVar10 = edge_type.vect._0_8_;
        uVar5._4_4_ = bx.smallend.vect[1];
        uVar5._0_4_ = bx.smallend.vect[0];
        unique0x1000296b = (pointer)CONCAT44(bx.bigend.vect[0],bx.smallend.vect[2]);
        sVar13 = CONCAT44(bx.bigend.vect[2],bx.bigend.vect[1]);
        bx.smallend.vect[0] = 0;
        bx.smallend.vect[1] = 0;
        bx.smallend.vect[2] = 0;
        bx.bigend.vect[0] = 0;
        bx.bigend.vect[1] = 0;
        bx.bigend.vect[2] = 0;
        if (edge_type.vect._0_8_ != 0) {
          uVar41 = local_718._0_8_ - edge_type.vect._0_8_;
          edge_type.vect._0_8_ = uVar5;
          local_718._0_8_ = sVar13;
          operator_delete((void *)uVar10,uVar41);
          uVar5 = edge_type.vect._0_8_;
          sVar13 = local_718._0_8_;
        }
        local_718._0_8_ = sVar13;
        edge_type.vect._0_8_ = uVar5;
        local_718._8_4_ = bx.btype.itype;
        pvVar12 = (void *)CONCAT44(bx.smallend.vect[1],bx.smallend.vect[0]);
        if (pvVar12 != (void *)0x0) {
          operator_delete(pvVar12,CONCAT44(bx.bigend.vect[2],bx.bigend.vect[1]) - (long)pvVar12);
        }
      }
      else {
        BoxList::swap((BoxList *)&edge_type,&cut_boxes);
        BoxList::coarsen((BoxList *)&edge_type,&crse_ratio);
      }
      BoxList::maxSize((BoxList *)&edge_type,(int)local_e38);
      iVar25 = result.bigend.vect[2];
      iVar24 = result.bigend.vect[1];
      iVar31 = result.bigend.vect[0];
      iVar30 = result.smallend.vect[2];
      lVar33 = (long)stack0xfffffffffffff8e0 - edge_type.vect._0_8_ >> 2;
      lVar45 = lVar33 * 0x6db6db6db6db6db7;
      if (lVar45 - (long)local_e30 != 0 && (long)local_e30 <= lVar45) {
        local_ec8 = (FabArray<amrex::FArrayBox> *)result.smallend.vect._0_8_;
        uStack_ec0 = 0;
        pFVar40 = local_e30;
        do {
          lVar35 = (long)pFVar40 * 0x1c;
          piVar36 = (int *)(edge_type.vect._0_8_ + lVar35);
          uVar47 = *(uint *)(edge_type.vect._0_8_ + 0x18 + lVar35);
          piVar2 = (int *)(edge_type.vect._0_8_ + lVar35);
          iVar32 = piVar2[2];
          bx.smallend.vect[0] = *piVar2 - 1;
          bx.smallend.vect[1] = piVar2[1] - 1;
          bx.smallend.vect[2] = iVar32 + -1;
          bx.bigend.vect[0] = piVar2[3] + 1;
          uVar5 = *(undefined8 *)(edge_type.vect._0_8_ + 0x10 + lVar35);
          bx.bigend.vect[1] = (int)uVar5 + 1;
          bx.bigend.vect[2] = (int)((ulong)uVar5 >> 0x20) + 1;
          bx.btype.itype = uVar47;
          lVar35 = 0;
          do {
            if ((uVar47 >> ((uint)lVar35 & 0x1f) & 1) == 0) {
              piVar2 = bx.bigend.vect + lVar35;
              *piVar2 = *piVar2 + 1;
            }
            lVar35 = lVar35 + 1;
          } while (lVar35 != 3);
          stack0xfffffffffffff5e0 = CONCAT44(uStack_a1c,7);
          lhs.btype.itype = 7;
          lhs.smallend.vect[1] =
               ~-(uint)((int)local_ec8._4_4_ < bx.smallend.vect[1]) & local_ec8._4_4_ |
               bx.smallend.vect[1] & -(uint)((int)local_ec8._4_4_ < bx.smallend.vect[1]);
          lhs.smallend.vect[0] =
               ~-(uint)((int)(uint)local_ec8 < bx.smallend.vect[0]) & (uint)local_ec8 |
               bx.smallend.vect[0] & -(uint)((int)(uint)local_ec8 < bx.smallend.vect[0]);
          lhs.smallend.vect[2] = bx.smallend.vect[2];
          if (iVar32 + -1 <= iVar30) {
            lhs.smallend.vect[2] = iVar30;
          }
          uVar47 = -(uint)(bx.bigend.vect[0] < iVar31);
          uVar48 = -(uint)(bx.bigend.vect[1] < iVar24);
          lhs.bigend.vect[0] = ~uVar47 & iVar31 | bx.bigend.vect[0] & uVar47;
          lhs.bigend.vect[1] = ~uVar48 & iVar24 | bx.bigend.vect[1] & uVar48;
          lhs.bigend.vect[2] = bx.bigend.vect[2];
          if (iVar25 <= bx.bigend.vect[2]) {
            lhs.bigend.vect[2] = iVar25;
          }
          iVar32 = GeometryShop<amrex::EB2::UnionIF<amrex::EB2::LatheIF<amrex::EB2::SplineIF>,_amrex::EB2::CylinderIF>,_int>
                   ::getBoxType_Cpu((GeometryShop<amrex::EB2::UnionIF<amrex::EB2::LatheIF<amrex::EB2::SplineIF>,_amrex::EB2::CylinderIF>,_int>
                                     *)local_ed0,&lhs,(Geometry *)&pp);
          if (iVar32 == 0) {
            lhs.smallend.vect._0_8_ = *(undefined8 *)piVar36;
            lhs.bigend.vect[1] = piVar36[4];
            lhs.bigend.vect[2] = piVar36[5];
            lhs.btype.itype = piVar36[6];
            lhs.smallend.vect[2] = (int)*(undefined8 *)(piVar36 + 2);
            lhs.bigend.vect[0] = (int)((ulong)*(undefined8 *)(piVar36 + 2) >> 0x20);
            if (((crse_ratio.vect[0] != 1) || (crse_ratio.vect[1] != 1)) ||
               (crse_ratio.vect[2] != 1)) {
              lhs.smallend.vect[1] = lhs.smallend.vect[1] * crse_ratio.vect[1];
              lhs.smallend.vect[0] = lhs.smallend.vect[0] * crse_ratio.vect[0];
              lhs.smallend.vect[2] = lhs.smallend.vect[2] * crse_ratio.vect[2];
              uVar47 = (uint)((lhs.btype.itype & 2) == 0);
              uVar48 = (uint)((lhs.btype.itype & 4) == 0);
              lhs.bigend.vect[0] =
                   (lhs.bigend.vect[0] + (~lhs.btype.itype & 1)) * crse_ratio.vect[0] -
                   (~lhs.btype.itype & 1);
              lhs.bigend.vect[1] = (lhs.bigend.vect[1] + uVar47) * crse_ratio.vect[1] - uVar47;
              lhs.bigend.vect[2] = (lhs.bigend.vect[2] + uVar48) * crse_ratio.vect[2] - uVar48;
            }
            if (cut_boxes.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                cut_boxes.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<amrex::Box,std::allocator<amrex::Box>>::
              _M_realloc_insert<amrex::Box_const&>
                        ((vector<amrex::Box,std::allocator<amrex::Box>> *)&cut_boxes,
                         (iterator)
                         cut_boxes.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                         super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                         super__Vector_impl_data._M_finish,&lhs);
            }
            else {
              *(ulong *)((cut_boxes.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                          super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                          super__Vector_impl_data._M_finish)->bigend).vect =
                   CONCAT44(lhs.bigend.vect[1],lhs.bigend.vect[0]);
              *(ulong *)(((cut_boxes.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                           super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                           super__Vector_impl_data._M_finish)->bigend).vect + 2) =
                   CONCAT44(lhs.btype.itype,lhs.bigend.vect[2]);
              *(undefined8 *)
               ((cut_boxes.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                 super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                 super__Vector_impl_data._M_finish)->smallend).vect = lhs.smallend.vect._0_8_;
              *(ulong *)(((cut_boxes.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                           super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                           super__Vector_impl_data._M_finish)->smallend).vect + 2) =
                   CONCAT44(lhs.bigend.vect[0],lhs.smallend.vect[2]);
              cut_boxes.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
              super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   cut_boxes.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                   super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                   super__Vector_impl_data._M_finish + 1;
            }
          }
          else if (iVar32 == 1) {
            lhs.smallend.vect._0_8_ = *(undefined8 *)piVar36;
            lhs.bigend.vect[1] = piVar36[4];
            lhs.bigend.vect[2] = piVar36[5];
            lhs.btype.itype = piVar36[6];
            lhs.smallend.vect[2] = (int)*(undefined8 *)(piVar36 + 2);
            lhs.bigend.vect[0] = (int)((ulong)*(undefined8 *)(piVar36 + 2) >> 0x20);
            if (((crse_ratio.vect[0] != 1) || (crse_ratio.vect[1] != 1)) ||
               (crse_ratio.vect[2] != 1)) {
              lhs.smallend.vect[1] = lhs.smallend.vect[1] * crse_ratio.vect[1];
              lhs.smallend.vect[0] = lhs.smallend.vect[0] * crse_ratio.vect[0];
              lhs.smallend.vect[2] = lhs.smallend.vect[2] * crse_ratio.vect[2];
              uVar47 = (uint)((lhs.btype.itype & 2) == 0);
              uVar48 = (uint)((lhs.btype.itype & 4) == 0);
              lhs.bigend.vect[0] =
                   (lhs.bigend.vect[0] + (~lhs.btype.itype & 1)) * crse_ratio.vect[0] -
                   (~lhs.btype.itype & 1);
              lhs.bigend.vect[1] = (lhs.bigend.vect[1] + uVar47) * crse_ratio.vect[1] - uVar47;
              lhs.bigend.vect[2] = (lhs.bigend.vect[2] + uVar48) * crse_ratio.vect[2] - uVar48;
            }
            if (covered_boxes.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                covered_boxes.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<amrex::Box,std::allocator<amrex::Box>>::
              _M_realloc_insert<amrex::Box_const&>
                        ((vector<amrex::Box,std::allocator<amrex::Box>> *)&covered_boxes,
                         (iterator)
                         covered_boxes.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                         super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                         super__Vector_impl_data._M_finish,&lhs);
            }
            else {
              *(ulong *)((covered_boxes.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>
                          .super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                          super__Vector_impl_data._M_finish)->bigend).vect =
                   CONCAT44(lhs.bigend.vect[1],lhs.bigend.vect[0]);
              *(ulong *)(((covered_boxes.m_lbox.
                           super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                           super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                           super__Vector_impl_data._M_finish)->bigend).vect + 2) =
                   CONCAT44(lhs.btype.itype,lhs.bigend.vect[2]);
              *(undefined8 *)
               ((covered_boxes.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                 super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                 super__Vector_impl_data._M_finish)->smallend).vect = lhs.smallend.vect._0_8_;
              *(ulong *)(((covered_boxes.m_lbox.
                           super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                           super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                           super__Vector_impl_data._M_finish)->smallend).vect + 2) =
                   CONCAT44(lhs.bigend.vect[0],lhs.smallend.vect[2]);
              covered_boxes.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
              super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   covered_boxes.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                   super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                   super__Vector_impl_data._M_finish + 1;
            }
          }
          pFVar40 = (FabArray<amrex::FArrayBox> *)
                    ((long)&(((FabArray<amrex::FArrayBox> *)&pFVar40->super_FabArrayBase)->
                            super_FabArrayBase)._vptr_FabArrayBase + (long)iVar29);
        } while (SBORROW8((long)pFVar40,lVar45) != (long)pFVar40 + lVar33 * -0x6db6db6db6db6db7 < 0)
        ;
      }
      AllGatherBoxes(&cut_boxes.m_lbox,0);
      __src = local_eb8;
      pGVar44 = local_ef0;
      if (edge_type.vect._0_8_ != 0) {
        operator_delete((void *)edge_type.vect._0_8_,local_718._0_8_ - edge_type.vect._0_8_);
      }
    }
    bVar28 = 0 < iVar43;
    iVar43 = iVar43 + -1;
  } while (bVar28);
  AllGatherBoxes(&covered_boxes.m_lbox,0);
  pBVar37 = covered_boxes.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
            super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((((pGVar44->super_Level).m_ngrow.vect[0] != 0) ||
      ((pGVar44->super_Level).m_ngrow.vect[1] != 0)) ||
     ((pGVar44->super_Level).m_ngrow.vect[2] != 0)) {
    for (; pBVar38 = cut_boxes.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                     super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                     super__Vector_impl_data._M_start,
        pBVar37 !=
        covered_boxes.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
        super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
        _M_finish; pBVar37 = pBVar37 + 1) {
      lVar33 = 0;
      do {
        iVar29 = (pGVar44->super_Level).m_ngrow.vect[lVar33];
        if (iVar29 != 0) {
          iVar43 = (pBVar37->smallend).vect[lVar33];
          if (iVar43 == (pBVar1->smallend).vect[lVar33]) {
            (pBVar37->smallend).vect[lVar33] = iVar43 - iVar29;
          }
          iVar29 = (pBVar37->bigend).vect[lVar33];
          if (iVar29 == (pGVar23->domain).bigend.vect[lVar33]) {
            (pBVar37->bigend).vect[lVar33] = iVar29 + (pGVar44->super_Level).m_ngrow.vect[lVar33];
          }
        }
        lVar33 = lVar33 + 1;
      } while (lVar33 != 3);
    }
    for (; pBVar38 !=
           cut_boxes.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
           super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
           super__Vector_impl_data._M_finish; pBVar38 = pBVar38 + 1) {
      lVar33 = 0;
      do {
        iVar29 = (pGVar44->super_Level).m_ngrow.vect[lVar33];
        if (iVar29 != 0) {
          iVar43 = (pBVar38->smallend).vect[lVar33];
          if (iVar43 == (pBVar1->smallend).vect[lVar33]) {
            (pBVar38->smallend).vect[lVar33] = iVar43 - iVar29;
          }
          iVar29 = (pBVar38->bigend).vect[lVar33];
          if (iVar29 == (pGVar23->domain).bigend.vect[lVar33]) {
            (pBVar38->bigend).vect[lVar33] = iVar29 + (pGVar44->super_Level).m_ngrow.vect[lVar33];
          }
        }
        lVar33 = lVar33 + 1;
      } while (lVar33 != 3);
    }
  }
  if ((cut_boxes.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
       super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
       _M_start ==
       cut_boxes.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
       super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
       _M_finish) &&
     (covered_boxes.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
      super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      covered_boxes.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
      super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
      _M_finish)) {
    Abort_host("AMReX_EB2_Level.H: Domain is completely covered");
  }
  if (covered_boxes.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
      super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      covered_boxes.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
      super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    if (2 < num_crse_opt) {
      BoxList::maxSize(&covered_boxes,(int)local_e38 << 2);
    }
    BoxArray::BoxArray((BoxArray *)&pp,&covered_boxes);
    BoxArray::operator=(&(local_ef0->super_Level).m_covered_grids,(BoxArray *)&pp);
    pGVar44 = local_ef0;
    BoxArray::~BoxArray((BoxArray *)&pp);
  }
  if (cut_boxes.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
      super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
      _M_start ==
      cut_boxes.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
      super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    BoxArray::BoxArray((BoxArray *)&pp);
    BoxArray::operator=(&(pGVar44->super_Level).m_grids,(BoxArray *)&pp);
    BoxArray::~BoxArray((BoxArray *)&pp);
    DistributionMapping::DistributionMapping((DistributionMapping *)&pp);
    ppbVar26 = pp.m_pstack.c.
               super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Deque_impl_data._M_map;
    sVar27 = pp.m_pstack.c.
             super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Deque_impl_data._M_map_size;
    pp.m_pstack.c.
    super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
    pp.m_pstack.c.
    super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Deque_impl_data._M_map_size = 0;
    p_Var6 = (pGVar44->super_Level).m_dmap.m_ref.
             super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    (pGVar44->super_Level).m_dmap.m_ref.
    super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)ppbVar26;
    (pGVar44->super_Level).m_dmap.m_ref.
    super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sVar27;
    if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6);
    }
    if (pp.m_pstack.c.
        super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Deque_impl_data._M_map_size != 0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 pp.m_pstack.c.
                 super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Deque_impl_data._M_map_size);
    }
    (pGVar44->super_Level).m_allregular = true;
    (pGVar44->super_Level).m_ok = true;
  }
  else {
    BoxArray::BoxArray((BoxArray *)&pp,&cut_boxes);
    this_00 = &(pGVar44->super_Level).m_grids;
    BoxArray::operator=(this_00,(BoxArray *)&pp);
    BoxArray::~BoxArray((BoxArray *)&pp);
    DistributionMapping::DistributionMapping
              ((DistributionMapping *)&pp,this_00,*(int *)(ParallelContext::frames + 0x10));
    ppbVar26 = pp.m_pstack.c.
               super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Deque_impl_data._M_map;
    sVar27 = pp.m_pstack.c.
             super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Deque_impl_data._M_map_size;
    pp.m_pstack.c.
    super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
    pp.m_pstack.c.
    super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Deque_impl_data._M_map_size = 0;
    p_Var6 = (pGVar44->super_Level).m_dmap.m_ref.
             super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    (pGVar44->super_Level).m_dmap.m_ref.
    super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)ppbVar26;
    (pGVar44->super_Level).m_dmap.m_ref.
    super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sVar27;
    if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6);
    }
    dm = &(pGVar44->super_Level).m_dmap;
    if (pp.m_pstack.c.
        super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Deque_impl_data._M_map_size != 0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 pp.m_pstack.c.
                 super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Deque_impl_data._M_map_size);
    }
    local_e40 = (FabArrayBase *)&(pGVar44->super_Level).m_mgf;
    MultiGFab::define((MultiGFab *)local_e40,this_00,dm);
    mf_info.alloc = true;
    mf_info.arena = (Arena *)0x0;
    mf_info.tags.
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    mf_info.tags.
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    mf_info.tags.
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    MFInfo::SetTag(&mf_info,"EB2::Level");
    this_01 = &(pGVar44->super_Level).m_cellflag;
    edge_type.vect._0_8_ = &PTR__FabFactory_0074f040;
    pp.m_pstack.c.
    super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Deque_impl_data._M_map_size._0_4_ = 2;
    pp.m_pstack.c.
    super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x200000002;
    (*(pGVar44->super_Level).m_cellflag.super_FabArrayBase._vptr_FabArrayBase[3])
              (this_01,this_00,dm,1,&pp,&mf_info,&edge_type);
    this_02 = &(pGVar44->super_Level).m_volfrac;
    pp.m_pstack.c.
    super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)&PTR__FabFactory_0074e8d0;
    MultiFab::define(this_02,this_00,dm,1,2,&mf_info,(FabFactory<amrex::FArrayBox> *)&pp);
    local_e30 = &(pGVar44->super_Level).m_centroid.super_FabArray<amrex::FArrayBox>;
    pp.m_pstack.c.
    super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)&PTR__FabFactory_0074e8d0;
    MultiFab::define((MultiFab *)local_e30,this_00,dm,3,2,&mf_info,
                     (FabFactory<amrex::FArrayBox> *)&pp);
    local_e38 = &(pGVar44->super_Level).m_bndryarea.super_FabArray<amrex::FArrayBox>;
    pp.m_pstack.c.
    super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)&PTR__FabFactory_0074e8d0;
    MultiFab::define((MultiFab *)local_e38,this_00,dm,1,2,&mf_info,
                     (FabFactory<amrex::FArrayBox> *)&pp);
    this_03 = &(pGVar44->super_Level).m_bndrycent;
    pp.m_pstack.c.
    super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)&PTR__FabFactory_0074e8d0;
    MultiFab::define(this_03,this_00,dm,3,2,&mf_info,(FabFactory<amrex::FArrayBox> *)&pp);
    this_04 = &(pGVar44->super_Level).m_bndrynorm;
    pp.m_pstack.c.
    super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)&PTR__FabFactory_0074e8d0;
    MultiFab::define(this_04,this_00,dm,3,2,&mf_info,(FabFactory<amrex::FArrayBox> *)&pp);
    lVar33 = 0;
    lVar45 = 0;
    do {
      iVar29 = (int)lVar45;
      if (iVar29 == 1) {
        iVar43 = 0;
        edge_type.vect[0] = 0;
        edge_type.vect[1] = 1;
      }
      else if (iVar29 == 0) {
        edge_type.vect[0] = 1;
        edge_type.vect[1] = 0;
        iVar43 = 0;
      }
      else {
        iVar43 = 1;
        edge_type.vect[0] = 0;
        edge_type.vect[1] = 0;
      }
      edge_type.vect[2] = iVar43;
      convert((BoxArray *)&pp,this_00,&edge_type);
      plVar42 = (long *)((long)&(local_ef0->super_Level).m_areafrac._M_elems[0].
                                super_FabArray<amrex::FArrayBox>.super_FabArrayBase.
                                _vptr_FabArrayBase + lVar33);
      bx.smallend.vect[0] = 0x74e8d0;
      bx.smallend.vect[1] = 0;
      (**(code **)(*plVar42 + 0x10))(plVar42,(BoxArray *)&pp,dm,1,2,&mf_info,&bx);
      BoxArray::~BoxArray((BoxArray *)&pp);
      if (iVar29 == 1) {
        edge_type.vect[2] = 0;
        edge_type.vect[0] = 0;
        edge_type.vect[1] = 1;
      }
      else if (iVar29 == 0) {
        edge_type.vect[0] = 1;
        edge_type.vect[1] = 0;
        edge_type.vect[2] = 0;
      }
      else {
        edge_type.vect[2] = 1;
        edge_type.vect[0] = 0;
        edge_type.vect[1] = 0;
      }
      convert((BoxArray *)&pp,this_00,&edge_type);
      plVar42 = (long *)((long)&(local_ef0->super_Level).m_facecent._M_elems[0].
                                super_FabArray<amrex::FArrayBox>.super_FabArrayBase.
                                _vptr_FabArrayBase + lVar33);
      bx.smallend.vect[0] = 0x74e8d0;
      bx.smallend.vect[1] = 0;
      (**(code **)(*plVar42 + 0x10))(plVar42,(BoxArray *)&pp,dm,2,2,&mf_info,&bx);
      BoxArray::~BoxArray((BoxArray *)&pp);
      edge_type.vect[0] = 1;
      edge_type.vect[1] = 1;
      stack0xfffffffffffff8e0 = (pointer)CONCAT44(uStack_71c,1);
      edge_type.vect[lVar45] = 0;
      convert((BoxArray *)&pp,this_00,&edge_type);
      plVar42 = (long *)((long)&(local_ef0->super_Level).m_edgecent._M_elems[0].
                                super_FabArray<amrex::FArrayBox>.super_FabArrayBase.
                                _vptr_FabArrayBase + lVar33);
      bx.smallend.vect[0] = 0x74e8d0;
      bx.smallend.vect[1] = 0;
      (**(code **)(*plVar42 + 0x10))(plVar42,(BoxArray *)&pp,dm,1,2,&mf_info,&bx);
      BoxArray::~BoxArray((BoxArray *)&pp);
      lVar45 = lVar45 + 1;
      lVar33 = lVar33 + 0x180;
    } while (lVar33 != 0x480);
    local_468.arr[0] = (local_eb8->super_CoordSys).dx[0];
    local_468.arr[1] = (local_eb8->super_CoordSys).dx[1];
    local_468.arr[2] = (local_eb8->super_CoordSys).dx[2];
    local_488.arr[0] = (local_eb8->prob_domain).xlo[0];
    local_488.arr[1] = (local_eb8->prob_domain).xlo[1];
    local_488.arr[2] = (local_eb8->prob_domain).xlo[2];
    lVar33 = 0;
    do {
      if (((char)local_ed8 == '\0') ||
         (*(char *)((long)(local_eb8->super_CoordSys).inv_dx + lVar33 + 0x19) == '\x01')) {
        piVar36 = bounding_box.smallend.vect + lVar33;
        *piVar36 = *piVar36 + -2;
        piVar36 = bounding_box.bigend.vect + lVar33;
        *piVar36 = *piVar36 + 2;
      }
      lVar33 = lVar33 + 1;
    } while (lVar33 != 3);
    if (maxiter < 1) {
      local_ec8 = (FabArray<amrex::FArrayBox> *)0x0;
    }
    else {
      pLVar14 = &local_ef0->super_Level;
      pLVar15 = &local_ef0->super_Level;
      pLVar16 = &local_ef0->super_Level;
      pLVar17 = &local_ef0->super_Level;
      pLVar18 = &local_ef0->super_Level;
      pLVar19 = &local_ef0->super_Level;
      pLVar20 = &local_ef0->super_Level;
      pLVar21 = &local_ef0->super_Level;
      pLVar22 = &local_ef0->super_Level;
      local_ec8 = (FabArray<amrex::FArrayBox> *)0x0;
      pGVar44 = local_ef0;
      while( true ) {
        pGVar23 = local_eb8;
        nsmallcells = 0;
        nmulticuts = 0;
        lVar33 = 0x24;
        do {
          *(undefined1 (*) [16])((long)&local_cc8.begin.y + lVar33) = (undefined1  [16])0x0;
          *(undefined ***)((long)&local_cc8.nstride + lVar33 + 4) = &PTR__BaseFab_0074eb90;
          *(undefined8 *)((long)&local_cc8.end.z + lVar33) = 0x100000001;
          *(undefined4 *)(&local_cc8.field_0x3c + lVar33) = 1;
          *(undefined1 (*) [16])
           ((long)&pp.m_pstack.c.
                   super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Deque_impl_data._M_map + lVar33) = (undefined1  [16])0x0;
          *(undefined1 (*) [16])
           ((long)&pp.m_pstack.c.
                   super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Deque_impl_data._M_map_size + lVar33 + 6) = (undefined1  [16])0x0
          ;
          lVar33 = lVar33 + 0x48;
        } while (lVar33 != 0xfc);
        result.smallend.vect[2] = 0;
        result.bigend.vect[0] = 0;
        result.bigend.vect[1] = 0;
        result.bigend.vect[2] = 0;
        result.btype.itype = 1;
        result.smallend.vect._0_8_ = &PTR__EBCellFlagFab_0074f0a8;
        local_d50._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        local_d50._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        local_d50._M_impl.super__Rb_tree_header._M_header._M_left =
             &local_d50._M_impl.super__Rb_tree_header._M_header;
        local_d50._M_impl.super__Rb_tree_header._M_node_count = 0;
        local_d50._M_impl.super__Rb_tree_header._M_header._M_right =
             local_d50._M_impl.super__Rb_tree_header._M_header._M_left;
        MFIter::MFIter((MFIter *)&lhs,local_e40,'\0');
        while (pFVar40 = (FabArray<amrex::FArrayBox> *)&edge_type, local_e88[0] < local_e80) {
          piVar36 = local_e88;
          if (local_e68 != (Vector<int,_std::allocator<int>_> *)0x0) {
            piVar36 = (local_e68->super_vector<int,_std::allocator<int>_>).
                      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                      _M_start + local_e88[0];
          }
          iVar29 = *piVar36;
          pGVar7 = (pGVar44->super_Level).m_mgf.super_LayoutData<amrex::EB2::GFab>.m_data.
                   super_vector<amrex::EB2::GFab,_std::allocator<amrex::EB2::GFab>_>.
                   super__Vector_base<amrex::EB2::GFab,_std::allocator<amrex::EB2::GFab>_>._M_impl.
                   super__Vector_impl_data._M_start;
          this_05 = pGVar7 + iVar29;
          uVar5 = *(undefined8 *)(pGVar7[iVar29].m_validbox.smallend.vect + 2);
          pIVar3 = &pGVar7[iVar29].m_validbox.bigend;
          local_448.bigend.vect[1] = (int)((ulong)*(undefined8 *)pIVar3->vect >> 0x20);
          local_448._20_8_ = *(undefined8 *)(pIVar3->vect + 2);
          local_448.smallend.vect._0_8_ = *(undefined8 *)&pGVar7[iVar29].m_validbox.smallend;
          local_448.smallend.vect[2] = (int)uVar5;
          local_448.bigend.vect[0] = (int)((ulong)uVar5 >> 0x20);
          if ((uint)local_ec8 == 0) {
            GeometryShop<amrex::EB2::UnionIF<amrex::EB2::LatheIF<amrex::EB2::SplineIF>,_amrex::EB2::CylinderIF>,_int>
            ::fillFab_Cpu((GeometryShop<amrex::EB2::UnionIF<amrex::EB2::LatheIF<amrex::EB2::SplineIF>,_amrex::EB2::CylinderIF>,_int>
                           *)local_ed0,&this_05->m_levelset,pGVar23,&bounding_box);
          }
          piVar36 = local_e88;
          if (local_e68 != (Vector<int,_std::allocator<int>_> *)0x0) {
            piVar36 = (local_e68->super_vector<int,_std::allocator<int>_>).
                      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                      _M_start + local_e88[0];
          }
          GFab::buildTypes(this_05,(pGVar44->super_Level).m_cellflag.m_fabs_v.
                                   super__Vector_base<amrex::EBCellFlagFab_*,_std::allocator<amrex::EBCellFlagFab_*>_>
                                   ._M_impl.super__Vector_impl_data._M_start[*piVar36]);
          crse_ratio.vect._0_8_ = (this_05->m_levelset).dptr;
          register0x00000080 =
               ((long)(this_05->m_levelset).domain.bigend.vect[0] -
               (long)(this_05->m_levelset).domain.smallend.vect[0]) + 1;
          local_cc8.p = (this_05->m_levelset).dptr;
          local_cc8.ncomp = (this_05->m_levelset).nvar;
          pBVar1 = &(this_05->m_levelset).domain;
          local_cc8.begin.z = (this_05->m_levelset).domain.smallend.vect[2];
          local_cc8.begin.x = (pBVar1->smallend).vect[0];
          local_cc8.begin.y = (pBVar1->smallend).vect[1];
          lVar33 = (long)(this_05->m_levelset).domain.bigend.vect[1] + 1;
          lVar45 = (long)(this_05->m_levelset).domain.bigend.vect[0];
          lVar35 = (long)(this_05->m_levelset).domain.bigend.vect[2] + 1;
          local_cc8.jstride = (lVar45 - (pBVar1->smallend).vect[0]) + 1;
          local_cc8.kstride =
               (lVar33 - (this_05->m_levelset).domain.smallend.vect[1]) * local_cc8.jstride;
          local_cc8.nstride = (lVar35 - local_cc8.begin.z) * local_cc8.kstride;
          local_cc8.end._0_8_ = lVar45 + 1U & 0xffffffff | lVar33 << 0x20;
          local_cc8.end.z = (int)lVar35;
          FabArray<amrex::EBCellFlagFab>::array<amrex::EBCellFlagFab,_0>
                    (&local_7a8,this_01,(MFIter *)&lhs);
          FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                    (&local_70,&this_02->super_FabArray<amrex::FArrayBox>,(MFIter *)&lhs);
          FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>(&local_b0,local_e30,(MFIter *)&lhs)
          ;
          FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>(&local_f0,local_e38,(MFIter *)&lhs)
          ;
          FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                    (&local_130,&this_03->super_FabArray<amrex::FArrayBox>,(MFIter *)&lhs);
          FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                    (&local_170,&this_04->super_FabArray<amrex::FArrayBox>,(MFIter *)&lhs);
          FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                    (&local_1c8,(FabArray<amrex::FArrayBox> *)&pLVar14->m_areafrac,(MFIter *)&lhs);
          FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                    (&local_208,&(pLVar15->m_areafrac)._M_elems[1].super_FabArray<amrex::FArrayBox>,
                     (MFIter *)&lhs);
          FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                    (&local_248,&(pLVar16->m_areafrac)._M_elems[2].super_FabArray<amrex::FArrayBox>,
                     (MFIter *)&lhs);
          FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                    (&local_388,(FabArray<amrex::FArrayBox> *)&pLVar17->m_facecent,(MFIter *)&lhs);
          FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                    (&local_3c8,&(pLVar18->m_facecent)._M_elems[1].super_FabArray<amrex::FArrayBox>,
                     (MFIter *)&lhs);
          FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                    (&local_408,&(pLVar19->m_facecent)._M_elems[2].super_FabArray<amrex::FArrayBox>,
                     (MFIter *)&lhs);
          local_4c8.p = (this_05->m_facetype)._M_elems[0].dptr;
          local_4c8.ncomp = (this_05->m_facetype)._M_elems[0].nvar;
          pBVar1 = &(this_05->m_facetype)._M_elems[0].domain;
          local_4c8.begin.z = (this_05->m_facetype)._M_elems[0].domain.smallend.vect[2];
          local_4c8.begin.x = (pBVar1->smallend).vect[0];
          local_4c8.begin.y = (pBVar1->smallend).vect[1];
          lVar33 = (long)(this_05->m_facetype)._M_elems[0].domain.bigend.vect[1] + 1;
          lVar45 = (long)(this_05->m_facetype)._M_elems[0].domain.bigend.vect[0];
          lVar35 = (long)(this_05->m_facetype)._M_elems[0].domain.bigend.vect[2] + 1;
          local_4c8.jstride = (lVar45 - (pBVar1->smallend).vect[0]) + 1;
          local_4c8.kstride =
               (lVar33 - (this_05->m_facetype)._M_elems[0].domain.smallend.vect[1]) *
               local_4c8.jstride;
          local_4c8.nstride = (lVar35 - local_4c8.begin.z) * local_4c8.kstride;
          local_4c8.end._0_8_ = lVar45 + 1U & 0xffffffff | lVar33 << 0x20;
          local_4c8.end.z = (int)lVar35;
          local_508.p = (this_05->m_facetype)._M_elems[1].dptr;
          local_508.ncomp = (this_05->m_facetype)._M_elems[1].nvar;
          pBVar1 = &(this_05->m_facetype)._M_elems[1].domain;
          local_508.begin.z = (this_05->m_facetype)._M_elems[1].domain.smallend.vect[2];
          local_508.begin.x = (pBVar1->smallend).vect[0];
          local_508.begin.y = (pBVar1->smallend).vect[1];
          lVar33 = (long)(this_05->m_facetype)._M_elems[1].domain.bigend.vect[1] + 1;
          lVar45 = (long)(this_05->m_facetype)._M_elems[1].domain.bigend.vect[0];
          lVar35 = (long)(this_05->m_facetype)._M_elems[1].domain.bigend.vect[2] + 1;
          local_508.jstride = (lVar45 - (pBVar1->smallend).vect[0]) + 1;
          local_508.kstride =
               (lVar33 - (this_05->m_facetype)._M_elems[1].domain.smallend.vect[1]) *
               local_508.jstride;
          local_508.nstride = (lVar35 - local_508.begin.z) * local_508.kstride;
          local_508.end._0_8_ = lVar45 + 1U & 0xffffffff | lVar33 << 0x20;
          local_508.end.z = (int)lVar35;
          local_548.p = (this_05->m_facetype)._M_elems[2].dptr;
          local_548.ncomp = (this_05->m_facetype)._M_elems[2].nvar;
          pBVar1 = &(this_05->m_facetype)._M_elems[2].domain;
          local_548.begin.z = (this_05->m_facetype)._M_elems[2].domain.smallend.vect[2];
          local_548.begin.x = (pBVar1->smallend).vect[0];
          local_548.begin.y = (pBVar1->smallend).vect[1];
          lVar33 = (long)(this_05->m_facetype)._M_elems[2].domain.bigend.vect[1] + 1;
          lVar45 = (long)(this_05->m_facetype)._M_elems[2].domain.bigend.vect[0];
          lVar35 = (long)(this_05->m_facetype)._M_elems[2].domain.bigend.vect[2] + 1;
          local_548.jstride = (lVar45 - (pBVar1->smallend).vect[0]) + 1;
          local_548.kstride =
               (lVar33 - (this_05->m_facetype)._M_elems[2].domain.smallend.vect[1]) *
               local_548.jstride;
          local_548.nstride = (lVar35 - local_548.begin.z) * local_548.kstride;
          local_548.end._0_8_ = lVar45 + 1U & 0xffffffff | lVar33 << 0x20;
          local_548.end.z = (int)lVar35;
          nmc = 0;
          nsm = 0;
          local_a78.p = (this_05->m_edgetype)._M_elems[0].dptr;
          local_a78.ncomp = (this_05->m_edgetype)._M_elems[0].nvar;
          pBVar1 = &(this_05->m_edgetype)._M_elems[0].domain;
          local_a78.begin.z = (this_05->m_edgetype)._M_elems[0].domain.smallend.vect[2];
          local_a78.begin.x = (pBVar1->smallend).vect[0];
          local_a78.begin.y = (pBVar1->smallend).vect[1];
          lVar33 = (long)(this_05->m_edgetype)._M_elems[0].domain.bigend.vect[1] + 1;
          local_a78.end.x = (this_05->m_edgetype)._M_elems[0].domain.bigend.vect[0];
          lVar45 = (long)(this_05->m_edgetype)._M_elems[0].domain.bigend.vect[2] + 1;
          local_a78.jstride = ((long)local_a78.end.x - (long)(pBVar1->smallend).vect[0]) + 1;
          local_a78.end.x = local_a78.end.x + 1;
          local_a78.kstride =
               (lVar33 - (this_05->m_edgetype)._M_elems[0].domain.smallend.vect[1]) *
               local_a78.jstride;
          local_a78.nstride = (lVar45 - local_a78.begin.z) * local_a78.kstride;
          local_a78.end.y = (int)lVar33;
          local_a78.end.z = (int)lVar45;
          local_ab8.p = (this_05->m_edgetype)._M_elems[1].dptr;
          local_ab8.ncomp = (this_05->m_edgetype)._M_elems[1].nvar;
          pBVar1 = &(this_05->m_edgetype)._M_elems[1].domain;
          local_ab8.begin.z = (this_05->m_edgetype)._M_elems[1].domain.smallend.vect[2];
          local_ab8.begin.x = (pBVar1->smallend).vect[0];
          local_ab8.begin.y = (pBVar1->smallend).vect[1];
          lVar33 = (long)(this_05->m_edgetype)._M_elems[1].domain.bigend.vect[1] + 1;
          local_ab8.end.x = (this_05->m_edgetype)._M_elems[1].domain.bigend.vect[0];
          lVar45 = (long)(this_05->m_edgetype)._M_elems[1].domain.bigend.vect[2] + 1;
          local_ab8.jstride = ((long)local_ab8.end.x - (long)(pBVar1->smallend).vect[0]) + 1;
          local_ab8.end.x = local_ab8.end.x + 1;
          local_ab8.kstride =
               (lVar33 - (this_05->m_edgetype)._M_elems[1].domain.smallend.vect[1]) *
               local_ab8.jstride;
          local_ab8.nstride = (lVar45 - local_ab8.begin.z) * local_ab8.kstride;
          local_ab8.end.y = (int)lVar33;
          local_ab8.end.z = (int)lVar45;
          local_af8.p = (this_05->m_edgetype)._M_elems[2].dptr;
          local_af8.ncomp = (this_05->m_edgetype)._M_elems[2].nvar;
          pBVar1 = &(this_05->m_edgetype)._M_elems[2].domain;
          local_af8.begin.z = (this_05->m_edgetype)._M_elems[2].domain.smallend.vect[2];
          local_af8.begin.x = (pBVar1->smallend).vect[0];
          local_af8.begin.y = (pBVar1->smallend).vect[1];
          lVar33 = (long)(this_05->m_edgetype)._M_elems[2].domain.bigend.vect[1] + 1;
          lVar45 = (long)(this_05->m_edgetype)._M_elems[2].domain.bigend.vect[0];
          lVar35 = (long)(this_05->m_edgetype)._M_elems[2].domain.bigend.vect[2] + 1;
          local_af8.jstride = (lVar45 - (pBVar1->smallend).vect[0]) + 1;
          local_af8.kstride =
               (lVar33 - (this_05->m_edgetype)._M_elems[2].domain.smallend.vect[1]) *
               local_af8.jstride;
          local_af8.nstride = (lVar35 - local_af8.begin.z) * local_af8.kstride;
          local_af8.end._0_8_ = lVar45 + 1U & 0xffffffff | lVar33 << 0x20;
          local_af8.end.z = (int)lVar35;
          FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                    (&local_7e8,(FabArray<amrex::FArrayBox> *)&pLVar20->m_edgecent,(MFIter *)&lhs);
          FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                    ((Array4<double> *)local_828,
                     &(pLVar21->m_edgecent)._M_elems[1].super_FabArray<amrex::FArrayBox>,
                     (MFIter *)&lhs);
          FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                    (&local_868,&(pLVar22->m_edgecent)._M_elems[2].super_FabArray<amrex::FArrayBox>,
                     (MFIter *)&lhs);
          this_06 = local_ed0;
          bx.bigend.vect[1] = (int)local_a78.kstride;
          bx.bigend.vect[2] = (int)((ulong)local_a78.kstride >> 0x20);
          bx.smallend.vect[0] = (int)local_a78.p;
          bx.smallend.vect[1] = (int)((ulong)local_a78.p >> 0x20);
          bx.smallend.vect[2] = (int)local_a78.jstride;
          bx.bigend.vect[0] = (int)((ulong)local_a78.jstride >> 0x20);
          if ((uint)local_ec8 == 0) {
            local_718._16_4_ = local_7e8.begin.x;
            local_718._20_4_ = local_7e8.begin.y;
            local_718._0_8_ = local_7e8.kstride;
            local_718._8_8_ = local_7e8.nstride;
            edge_type.vect._0_8_ = local_7e8.p;
            stack0xfffffffffffff8e0 = (pointer)local_7e8.jstride;
            peStack_6c8 = (element_type *)local_828._32_8_;
            local_6d8 = (element_type *)local_828._16_8_;
            _Stack_6d0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_828._24_8_;
            local_718._48_8_ = local_828._0_8_;
            local_718._56_8_ = local_828._8_8_;
            aDStack_688[0].x = local_868.begin.x;
            aDStack_688[0].y = local_868.begin.y;
            local_698 = (pointer)local_868.kstride;
            p_Stack_690 = (_Bit_type *)local_868.nstride;
            local_6a8 = local_868.p;
            piStack_6a0 = (pointer)local_868.jstride;
            stack0xfffffffffffff5e0 = local_a78.nstride;
            type = (Array4<const_unsigned_int> *)&bx;
            lVar33 = 0;
            do {
              GeometryShop<amrex::EB2::UnionIF<amrex::EB2::LatheIF<amrex::EB2::SplineIF>,_amrex::EB2::CylinderIF>,_int>
              ::getIntercept_Cpu((GeometryShop<amrex::EB2::UnionIF<amrex::EB2::LatheIF<amrex::EB2::SplineIF>,_amrex::EB2::CylinderIF>,_int>
                                  *)this_06,(Array4<double> *)pFVar40,type,pGVar23,&bounding_box,
                                 (int)lVar33);
              lVar33 = lVar33 + 1;
              type = type + 1;
              pFVar40 = (FabArray<amrex::FArrayBox> *)
                        ((pFVar40->super_FabArrayBase).boxarray.m_bat.m_op.m_bndryReg.m_doilo.vect +
                        2);
            } while (lVar33 != 3);
          }
          else {
            local_718._16_4_ = local_7e8.begin.x;
            local_718._20_4_ = local_7e8.begin.y;
            local_718._0_8_ = local_7e8.kstride;
            local_718._8_8_ = local_7e8.nstride;
            edge_type.vect._0_8_ = local_7e8.p;
            stack0xfffffffffffff8e0 = (pointer)local_7e8.jstride;
            peStack_6c8 = (element_type *)local_828._32_8_;
            local_6d8 = (element_type *)local_828._16_8_;
            _Stack_6d0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_828._24_8_;
            local_718._48_8_ = local_828._0_8_;
            local_718._56_8_ = local_828._8_8_;
            aDStack_688[0].x = local_868.begin.x;
            aDStack_688[0].y = local_868.begin.y;
            local_698 = (pointer)local_868.kstride;
            p_Stack_690 = (_Bit_type *)local_868.nstride;
            local_6a8 = local_868.p;
            piStack_6a0 = (pointer)local_868.jstride;
            stack0xfffffffffffff5e0 = local_a78.nstride;
            GeometryShop<amrex::EB2::UnionIF<amrex::EB2::LatheIF<amrex::EB2::SplineIF>,_amrex::EB2::CylinderIF>,_int>
            ::updateIntercept((GeometryShop<amrex::EB2::UnionIF<amrex::EB2::LatheIF<amrex::EB2::SplineIF>,_amrex::EB2::CylinderIF>,_int>
                               *)local_ed0,(Array<Array4<Real>,_3> *)pFVar40,
                              (Array<Array4<const_Type_t>,_3> *)&bx,
                              (Array4<const_double> *)&crse_ratio,pGVar23);
          }
          lVar33 = 0;
          do {
            BaseFab<double>::resize
                      ((BaseFab<double> *)
                       ((long)&pp.m_pstack.c.
                               super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Deque_impl_data._M_map + lVar33),
                       (Box *)((long)pGVar7[iVar29].m_facetype._M_elems[0].domain.smallend.vect +
                              lVar33),3,(Arena *)0x0);
            lVar33 = lVar33 + 0x48;
          } while (lVar33 != 0xd8);
          local_718._16_8_ =
               CONCAT44(pp.m_pstack.c.
                        super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Deque_impl_data._M_start._M_first._4_4_,
                        (int)pp.m_pstack.c.
                             super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Deque_impl_data._M_start._M_first);
          edge_type.vect._0_8_ =
               pp.m_pstack.c.
               super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Deque_impl_data._M_start._M_cur;
          register0x00000088 =
               (pointer)(((long)pp.m_pstack.c.
                                super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Deque_impl_data._M_start._M_last._4_4_ -
                         (long)(int)pp.m_pstack.c.
                                    super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Deque_impl_data._M_start._M_first) + 1);
          local_718._0_8_ =
               (((long)(int)pp.m_pstack.c.
                            super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Deque_impl_data._M_start._M_node + 1) -
               (long)pp.m_pstack.c.
                     super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Deque_impl_data._M_start._M_first._4_4_) *
               (long)register0x00000088;
          local_718._8_8_ =
               (((long)pp.m_pstack.c.
                       super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Deque_impl_data._M_start._M_node._4_4_ + 1) -
               (long)(int)pp.m_pstack.c.
                          super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Deque_impl_data._M_start._M_last) * local_718._0_8_;
          local_718._28_4_ =
               pp.m_pstack.c.
               super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Deque_impl_data._M_start._M_last._4_4_ + 1;
          local_718._24_4_ =
               (int)pp.m_pstack.c.
                    super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_last;
          local_718._32_4_ =
               (undefined4)
               ((long)(int)pp.m_pstack.c.
                           super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Deque_impl_data._M_start._M_node + 1);
          local_718._36_8_ =
               CONCAT44(pp.m_pstack.c.
                        super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Deque_impl_data._M_finish._M_cur._4_4_,
                        (int)((long)pp.m_pstack.c.
                                    super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Deque_impl_data._M_start._M_node._4_4_ + 1));
          bx.smallend.vect[0] = (int)local_c30._M_pi;
          bx.smallend.vect[1] = (int)((ulong)local_c30._M_pi >> 0x20);
          bx._8_8_ = ((long)local_c1c - (long)local_c28) + 1;
          bx.bigend.vect._4_8_ = (((long)local_c18 + 1) - (long)local_c24) * bx._8_8_;
          register0x00000088 = (((long)local_c14 + 1) - (long)local_c20) * bx.bigend.vect._4_8_;
          local_8a8.begin.y = local_bdc[0].smallend.vect[0];
          local_8a8.begin.x = (int)local_be0;
          local_8a8.p = local_be8;
          local_8a8.jstride = ((long)local_bdc[0].smallend.vect[2] - (long)(int)local_be0) + 1;
          local_8a8.kstride =
               (((long)local_bdc[0].bigend.vect[0] + 1) - (long)local_bdc[0].smallend.vect[0]) *
               local_8a8.jstride;
          local_8a8.nstride =
               (((long)local_bdc[0].bigend.vect[1] + 1) - (long)local_bdc[0].smallend.vect[1]) *
               local_8a8.kstride;
          local_8a8.begin.z = local_bdc[0].smallend.vect[1];
          local_8a8.end._0_8_ =
               (long)local_bdc[0].smallend.vect[2] + 1U & 0xffffffff |
               (long)local_bdc[0].bigend.vect[0] + 1 << 0x20;
          local_8a8.end.z = (int)((long)local_bdc[0].bigend.vect[1] + 1);
          local_8a8.ncomp = local_bdc[0].btype.itype;
          local_8e8.p = (EBCellFlag *)local_7e8.p;
          local_8e8.jstride = local_7e8.jstride;
          local_8e8.kstride = local_7e8.kstride;
          local_8e8.nstride = local_7e8.nstride;
          local_8e8.begin.z = local_7e8.begin.z;
          local_8e8.begin.x = local_7e8.begin.x;
          local_8e8.begin.y = local_7e8.begin.y;
          local_8e8.end.z = local_7e8.end.z;
          local_8e8.ncomp = local_7e8.ncomp;
          local_588._0_8_ = local_828._0_8_;
          local_588._8_8_ = local_828._8_8_;
          local_588._16_8_ = local_828._16_8_;
          local_588._24_8_ = local_828._24_8_;
          local_568.z = iStack_800;
          local_568.x = local_828._32_4_;
          local_568.y = local_828._36_4_;
          local_55c.z = iStack_7f4;
          local_550 = iStack_7f0;
          local_768.p = local_868.p;
          local_768.jstride = local_868.jstride;
          local_768.kstride = local_868.kstride;
          local_768.nstride = local_868.nstride;
          local_768.begin.z = local_868.begin.z;
          local_768.begin.x = local_868.begin.x;
          local_768.begin.y = local_868.begin.y;
          local_768.end.z = local_868.end.z;
          local_768.ncomp = local_868.ncomp;
          nmc = build_faces(&local_448,&local_7a8,&local_4c8,&local_508,&local_548,&local_a78,
                            &local_ab8,&local_af8,&local_cc8,(Array4<const_double> *)&local_8e8,
                            (Array4<const_double> *)local_588,&local_768,&local_1c8,&local_208,
                            &local_248,&local_388,&local_3c8,&local_408,(Array4<double> *)&edge_type
                            ,(Array4<double> *)&bx,&local_8a8,&local_468,&local_488,
                            cover_multiple_cuts);
          pGVar44 = local_ef0;
          piVar36 = local_e88;
          if (local_e68 != (Vector<int,_std::allocator<int>_> *)0x0) {
            piVar36 = (local_e68->super_vector<int,_std::allocator<int>_>).
                      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                      _M_start + local_e88[0];
          }
          BaseFab<amrex::EBCellFlag>::resize
                    ((BaseFab<amrex::EBCellFlag> *)&result,
                     &((local_ef0->super_Level).m_cellflag.m_fabs_v.
                       super__Vector_base<amrex::EBCellFlagFab_*,_std::allocator<amrex::EBCellFlagFab_*>_>
                       ._M_impl.super__Vector_impl_data._M_start[*piVar36]->
                      super_BaseFab<amrex::EBCellFlag>).domain,1,(Arena *)0x0);
          arena = (Arena *)CONCAT44(result.bigend.vect[0],result.smallend.vect[2]);
          if (arena == (Arena *)0x0) {
            arena = The_Arena();
          }
          Gpu::Elixir::Elixir(&cellflagtmp_eli,(void *)0x0,arena);
          local_8e8.p = (EBCellFlag *)CONCAT44(result.bigend.vect[2],result.bigend.vect[1]);
          local_8e8.begin.y = 1;
          local_8e8.begin.x = result.btype.itype;
          local_8e8.jstride = 1 - (long)(int)result.btype.itype;
          local_8e8.kstride = 0;
          local_8e8.nstride = 0;
          local_8e8.begin.z = 1;
          local_8e8.end.x = 1;
          local_8e8.end.y = 1;
          local_8e8.end.z = 1;
          local_8e8.ncomp = 0;
          local_588._0_8_ = local_388.p;
          local_588._8_8_ = local_388.jstride;
          local_588._16_8_ = local_388.kstride;
          local_588._24_8_ = local_388.nstride;
          local_568.z = local_388.begin.z;
          local_568.x = local_388.begin.x;
          local_568.y = local_388.begin.y;
          local_55c.z = local_388.end.z;
          local_55c.x = local_388.end.x;
          local_55c.y = local_388.end.y;
          local_550 = local_388.ncomp;
          local_768.p = local_3c8.p;
          local_768.jstride = local_3c8.jstride;
          local_768.kstride = local_3c8.kstride;
          local_768.nstride = local_3c8.nstride;
          local_768.begin.z = local_3c8.begin.z;
          local_768.begin.x = local_3c8.begin.x;
          local_768.begin.y = local_3c8.begin.y;
          local_768.end.z = local_3c8.end.z;
          local_768.end.x = local_3c8.end.x;
          local_768.end.y = local_3c8.end.y;
          local_768.ncomp = local_3c8.ncomp;
          local_288.p = local_408.p;
          local_288.jstride = local_408.jstride;
          local_288.kstride = local_408.kstride;
          local_288.nstride = local_408.nstride;
          local_288.begin.z = local_408.begin.z;
          local_288.begin.x = local_408.begin.x;
          local_288.begin.y = local_408.begin.y;
          local_288.end.z = local_408.end.z;
          local_288.end.x = local_408.end.x;
          local_288.end.y = local_408.end.y;
          local_288.ncomp = local_408.ncomp;
          local_2c8.p = (double *)edge_type.vect._0_8_;
          local_2c8.jstride = (Long)stack0xfffffffffffff8e0;
          local_2c8.kstride = local_718._0_8_;
          local_2c8.nstride = local_718._8_8_;
          local_2c8.begin.z = local_718._24_4_;
          local_2c8.begin.x = local_718._16_4_;
          local_2c8.begin.y = local_718._20_4_;
          local_2c8.end.z = local_718._36_4_;
          local_2c8.end.y = local_718._32_4_;
          local_2c8.end.x = local_718._28_4_;
          local_2c8.ncomp = local_718._40_4_;
          local_308.p = (double *)CONCAT44(bx.smallend.vect[1],bx.smallend.vect[0]);
          local_308.jstride._0_4_ = bx.smallend.vect[2];
          local_308.jstride._4_4_ = bx.bigend.vect[0];
          local_308.kstride._0_4_ = bx.bigend.vect[1];
          local_308.kstride._4_4_ = bx.bigend.vect[2];
          local_308.nstride = stack0xfffffffffffff5e0;
          local_348.p = local_8a8.p;
          local_348.jstride = local_8a8.jstride;
          local_348.kstride = local_8a8.kstride;
          local_348.nstride = local_8a8.nstride;
          local_348.begin.z = local_8a8.begin.z;
          local_348.begin.x = local_8a8.begin.x;
          local_348.begin.y = local_8a8.begin.y;
          local_348.end.z = local_8a8.end.z;
          local_348.end.x = local_8a8.end.x;
          local_348.end.y = local_8a8.end.y;
          local_348.ncomp = local_8a8.ncomp;
          local_308.end._0_8_ = (long)local_c1c + 1U & 0xffffffff | (long)local_c18 + 1 << 0x20;
          local_308.end.z = (int)((long)local_c14 + 1);
          build_cells(&local_448,&local_7a8,&local_4c8,&local_508,&local_548,&local_1c8,&local_208,
                      &local_248,(Array4<const_double> *)local_588,&local_768,&local_288,&local_2c8,
                      &local_308,&local_348,&local_70,&local_b0,&local_f0,&local_130,&local_170,
                      &local_8e8,&local_cc8,small_volfrac,pGVar23,(bool)(char)local_ed8,
                      cover_multiple_cuts,&nsm,&nmc);
          nsmallcells = nsmallcells + nsm;
          nmulticuts = nmulticuts + nmc;
          Gpu::Elixir::~Elixir(&cellflagtmp_eli);
          MFIter::operator++((MFIter *)&lhs);
        }
        MFIter::~MFIter((MFIter *)&lhs);
        std::
        _Rb_tree<amrex::Box,_std::pair<const_amrex::Box,_amrex::EBCellFlagFab::NumCells>,_std::_Select1st<std::pair<const_amrex::Box,_amrex::EBCellFlagFab::NumCells>_>,_std::less<amrex::Box>,_std::allocator<std::pair<const_amrex::Box,_amrex::EBCellFlagFab::NumCells>_>_>
        ::~_Rb_tree(&local_d50);
        result.smallend.vect._0_8_ = &PTR__BaseFab_0074f108;
        BaseFab<amrex::EBCellFlag>::clear((BaseFab<amrex::EBCellFlag> *)&result);
        lVar33 = 0x90;
        do {
          this_07 = (BaseFab<double> *)
                    ((long)&pp.m_pstack.c.
                            super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Deque_impl_data._M_map + lVar33);
          this_07->_vptr_BaseFab = (_func_int **)&PTR__BaseFab_0074eb90;
          BaseFab<double>::clear(this_07);
          lVar33 = lVar33 + -0x48;
        } while (lVar33 != -0x48);
        pp.m_pstack.c.
        super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Deque_impl_data._M_map_size = (size_t)&nmulticuts;
        pp.m_pstack.c.
        super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)&nsmallcells;
        __l._M_len = 2;
        __l._M_array = (iterator)&pp;
        std::vector<std::reference_wrapper<int>,_std::allocator<std::reference_wrapper<int>_>_>::
        vector(&local_420,__l,(allocator_type *)pFVar40);
        pGVar44 = local_ef0;
        piVar4 = &pp.m_pstack.c.
                  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Deque_impl_data._M_start;
        if (local_420.
            super__Vector_base<std::reference_wrapper<int>,_std::allocator<std::reference_wrapper<int>_>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_420.
                          super__Vector_base<std::reference_wrapper<int>,_std::allocator<std::reference_wrapper<int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_420.
                                super__Vector_base<std::reference_wrapper<int>,_std::allocator<std::reference_wrapper<int>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_420.
                                super__Vector_base<std::reference_wrapper<int>,_std::allocator<std::reference_wrapper<int>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        bVar28 = nmulticuts == 0;
        bVar9 = nsmallcells == 0;
        if (bVar28 && bVar9) break;
        MultiGFab::getLevelSet((MultiFab *)pFVar40,(MultiGFab *)local_e40);
        PVar49 = Geometry::periodicity(local_eb8);
        pp.m_pstack.c.
        super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Deque_impl_data._0_12_ = PVar49.period.vect;
        FabArray<amrex::FArrayBox>::FillBoundary<double>(pFVar40,(Periodicity *)&pp,false);
        iVar29 = Verbose();
        if (0 < iVar29) {
          cVar8 = (char)piVar4;
          if (nsmallcells != 0) {
            pp.m_pstack.c.
            super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Deque_impl_data._M_map_size = (size_t)OutStream();
            pp.m_pstack.c.
            super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Deque_impl_data._M_map._4_4_ = *(undefined4 *)(DAT_00756620 + -0x48);
            pp.m_pstack.c.
            super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Deque_impl_data._M_map._0_4_ = *(undefined4 *)(DAT_00756620 + -0x30);
            std::__cxx11::ostringstream::ostringstream((ostringstream *)piVar4);
            *(undefined8 *)
             ((long)&pp.m_pstack.c.
                     super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Deque_impl_data._M_start._M_first +
             pp.m_pstack.c.
             super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_cur[-1]._M_string_length) =
                 *(undefined8 *)
                  (pp.m_pstack.c.
                   super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Deque_impl_data._M_map_size + 8 +
                  *(long *)(*(long *)pp.m_pstack.c.
                                     super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Deque_impl_data._M_map_size + -0x18));
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)piVar4,"AMReX EB: Iter. ",0x10);
            std::ostream::operator<<(piVar4,(int)local_ec8 + 1);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)piVar4," fixed ",7);
            std::ostream::operator<<(piVar4,nsmallcells);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)piVar4," small cells",0xc)
            ;
            std::ios::widen((char)pp.m_pstack.c.
                                  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Deque_impl_data._M_start._M_cur[-1].
                                  _M_string_length + cVar8);
            std::ostream::put(cVar8);
            std::ostream::flush();
            Print::~Print((Print *)&pp);
          }
          if (nmulticuts != 0) {
            pp.m_pstack.c.
            super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Deque_impl_data._M_map_size = (size_t)OutStream();
            pp.m_pstack.c.
            super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Deque_impl_data._M_map._4_4_ = *(undefined4 *)(DAT_00756620 + -0x48);
            pp.m_pstack.c.
            super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Deque_impl_data._M_map._0_4_ = *(undefined4 *)(DAT_00756620 + -0x30);
            std::__cxx11::ostringstream::ostringstream((ostringstream *)piVar4);
            *(undefined8 *)
             ((long)&pp.m_pstack.c.
                     super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Deque_impl_data._M_start._M_first +
             pp.m_pstack.c.
             super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_cur[-1]._M_string_length) =
                 *(undefined8 *)
                  (pp.m_pstack.c.
                   super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Deque_impl_data._M_map_size + 8 +
                  *(long *)(*(long *)pp.m_pstack.c.
                                     super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Deque_impl_data._M_map_size + -0x18));
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)piVar4,"AMReX EB: Iter. ",0x10);
            std::ostream::operator<<(piVar4,(int)local_ec8 + 1);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)piVar4," fixed ",7);
            std::ostream::operator<<(piVar4,nmulticuts);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)piVar4," multicuts",10);
            std::ios::widen((char)pp.m_pstack.c.
                                  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Deque_impl_data._M_start._M_cur[-1].
                                  _M_string_length + cVar8);
            std::ostream::put(cVar8);
            std::ostream::flush();
            Print::~Print((Print *)&pp);
          }
        }
        MultiFab::~MultiFab((MultiFab *)pFVar40);
        if ((bVar28 && bVar9) ||
           (uVar47 = (int)local_ec8 + 1, local_ec8 = (FabArray<amrex::FArrayBox> *)(ulong)uVar47,
           maxiter <= (int)uVar47)) break;
      }
    }
    if (maxiter <= (int)local_ec8) {
      Assert_host("iter < maxiter",
                  "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/amrex/Src/EB/AMReX_EB2_Level.H"
                  ,0x1d1,"\"EB: failed to fix small cells\"");
    }
    MFIter::MFIter((MFIter *)&pp,local_e40,'\0');
    if ((int)pp.m_pstack.c.
             super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_last <
        (int)pp.m_pstack.c.
             super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_node) {
      local_ed0 = (FabArray<amrex::FArrayBox> *)&(local_ef0->super_Level).m_edgecent;
      local_ec8 = &(local_ef0->super_Level).m_edgecent._M_elems[1].super_FabArray<amrex::FArrayBox>;
      pLVar14 = &local_ef0->super_Level;
      do {
        ppbVar39 = &pp.m_pstack.c.
                    super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_last;
        if (pp.m_pstack.c.
            super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_last != (_Elt_pointer)0x0) {
          ppbVar39 = (_Elt_pointer *)
                     (((pp.m_pstack.c.
                        super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Deque_impl_data._M_finish._M_last)->_M_dataplus)._M_p +
                     (long)(int)pp.m_pstack.c.
                                super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Deque_impl_data._M_start._M_last * 4);
        }
        iVar29 = *(int *)ppbVar39;
        pGVar7 = (local_ef0->super_Level).m_mgf.super_LayoutData<amrex::EB2::GFab>.m_data.
                 super_vector<amrex::EB2::GFab,_std::allocator<amrex::EB2::GFab>_>.
                 super__Vector_base<amrex::EB2::GFab,_std::allocator<amrex::EB2::GFab>_>._M_impl.
                 super__Vector_impl_data._M_start;
        edge_type.vect._0_8_ = pGVar7[iVar29].m_levelset.dptr;
        iVar43 = pGVar7[iVar29].m_levelset.domain.smallend.vect[0];
        local_718._24_4_ = pGVar7[iVar29].m_levelset.domain.smallend.vect[2];
        iVar30 = pGVar7[iVar29].m_levelset.domain.smallend.vect[1];
        lVar33 = (long)pGVar7[iVar29].m_levelset.domain.bigend.vect[1] + 1;
        iVar31 = pGVar7[iVar29].m_levelset.domain.bigend.vect[0];
        lVar45 = (long)pGVar7[iVar29].m_levelset.domain.bigend.vect[2] + 1;
        register0x00000080 = (pointer)(((long)iVar31 - (long)iVar43) + 1);
        local_718._28_4_ = iVar31 + 1;
        local_718._0_8_ = (lVar33 - iVar30) * (long)register0x00000080;
        local_718._8_8_ = (lVar45 - (int)local_718._24_4_) * local_718._0_8_;
        local_718._16_8_ = CONCAT44(iVar30,iVar43);
        local_718._32_4_ = (undefined4)lVar33;
        local_718._36_8_ = CONCAT44(pGVar7[iVar29].m_levelset.nvar,(int)lVar45);
        FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  ((Array4<double> *)&bx,local_ed0,(MFIter *)&pp);
        FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  ((Array4<double> *)&result,local_ec8,(MFIter *)&pp);
        FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  ((Array4<double> *)&lhs,
                   &(pLVar14->m_edgecent)._M_elems[2].super_FabArray<amrex::FArrayBox>,(MFIter *)&pp
                  );
        crse_ratio.vect._0_8_ = pGVar7[iVar29].m_edgetype._M_elems[0].dptr;
        register0x00000080 =
             ((long)pGVar7[iVar29].m_edgetype._M_elems[0].domain.bigend.vect[0] -
             (long)pGVar7[iVar29].m_edgetype._M_elems[0].domain.smallend.vect[0]) + 1;
        local_cc8.p = (double *)pGVar7[iVar29].m_edgetype._M_elems[1].dptr;
        local_cc8.ncomp = pGVar7[iVar29].m_edgetype._M_elems[1].nvar;
        iVar43 = pGVar7[iVar29].m_edgetype._M_elems[1].domain.smallend.vect[0];
        local_cc8.begin.z = pGVar7[iVar29].m_edgetype._M_elems[1].domain.smallend.vect[2];
        iVar30 = pGVar7[iVar29].m_edgetype._M_elems[1].domain.smallend.vect[1];
        lVar33 = (long)pGVar7[iVar29].m_edgetype._M_elems[1].domain.bigend.vect[1] + 1;
        lVar45 = (long)pGVar7[iVar29].m_edgetype._M_elems[1].domain.bigend.vect[0];
        lVar35 = (long)pGVar7[iVar29].m_edgetype._M_elems[1].domain.bigend.vect[2] + 1;
        local_cc8.jstride = (lVar45 - iVar43) + 1;
        local_cc8.kstride = (lVar33 - iVar30) * local_cc8.jstride;
        local_cc8.nstride = (lVar35 - local_cc8.begin.z) * local_cc8.kstride;
        local_cc8.begin.y = iVar30;
        local_cc8.begin.x = iVar43;
        local_cc8.end._0_8_ = lVar45 + 1U & 0xffffffff | lVar33 << 0x20;
        local_cc8.end.z = (int)lVar35;
        local_7a8.p = (EBCellFlag *)pGVar7[iVar29].m_edgetype._M_elems[2].dptr;
        local_7a8.ncomp = pGVar7[iVar29].m_edgetype._M_elems[2].nvar;
        iVar43 = pGVar7[iVar29].m_edgetype._M_elems[2].domain.smallend.vect[0];
        local_7a8.begin.z = pGVar7[iVar29].m_edgetype._M_elems[2].domain.smallend.vect[2];
        iVar30 = pGVar7[iVar29].m_edgetype._M_elems[2].domain.smallend.vect[1];
        lVar33 = (long)pGVar7[iVar29].m_edgetype._M_elems[2].domain.bigend.vect[1] + 1;
        lVar45 = (long)pGVar7[iVar29].m_edgetype._M_elems[2].domain.bigend.vect[0];
        lVar35 = (long)pGVar7[iVar29].m_edgetype._M_elems[2].domain.bigend.vect[2] + 1;
        local_7a8.jstride = (lVar45 - iVar43) + 1;
        local_7a8.kstride = (lVar33 - iVar30) * local_7a8.jstride;
        local_7a8.nstride = (lVar35 - local_7a8.begin.z) * local_7a8.kstride;
        local_7a8.begin.y = iVar30;
        local_7a8.begin.x = iVar43;
        local_7a8.end._0_8_ = lVar45 + 1U & 0xffffffff | lVar33 << 0x20;
        local_7a8.end.z = (int)lVar35;
        intercept_to_edge_centroid
                  ((Array4<double> *)&bx,(Array4<double> *)&result,(Array4<double> *)&lhs,
                   (Array4<const_unsigned_int> *)&crse_ratio,
                   (Array4<const_unsigned_int> *)&local_cc8,(Array4<const_unsigned_int> *)&local_7a8
                   ,(Array4<const_double> *)&edge_type,&local_468,&local_488);
        MFIter::operator++((MFIter *)&pp);
      } while ((int)pp.m_pstack.c.
                    super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_last <
               (int)pp.m_pstack.c.
                    super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_node);
    }
    MFIter::~MFIter((MFIter *)&pp);
    MultiGFab::getLevelSet((MultiFab *)&pp,(MultiGFab *)local_e40);
    pGVar44 = local_ef0;
    FabArray<amrex::FArrayBox>::operator=
              (&(local_ef0->super_Level).m_levelset.super_FabArray<amrex::FArrayBox>,
               (FabArray<amrex::FArrayBox> *)&pp);
    MultiFab::~MultiFab((MultiFab *)&pp);
    (pGVar44->super_Level).m_ok = true;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&mf_info.tags.
               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             );
  }
  if (covered_boxes.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
      super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(covered_boxes.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                    super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)covered_boxes.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>
                          .super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)covered_boxes.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>
                          .super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (cut_boxes.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
      super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(cut_boxes.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                    super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)cut_boxes.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                          super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)cut_boxes.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                          super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void
GShopLevel<G>::define_fine (G const& gshop, const Geometry& geom,
                            int max_grid_size, int ngrow, bool extend_domain_face, int num_crse_opt)
{
    if (amrex::Verbose() > 0 && extend_domain_face == false) {
        amrex::Print() << "AMReX WARNING: extend_domain_face=false is not recommended!\n";
    }

    BL_PROFILE("EB2::GShopLevel()-fine");

#ifdef AMREX_USE_FLOAT
    Real small_volfrac = 1.e-5_rt;
#else
    Real small_volfrac = 1.e-14;
#endif
    bool cover_multiple_cuts = false;
    int maxiter = 32;
    {
        ParmParse pp("eb2");
        pp.queryAdd("small_volfrac", small_volfrac);
        pp.queryAdd("cover_multiple_cuts", cover_multiple_cuts);
        pp.queryAdd("maxiter", maxiter);
    }

    // make sure ngrow is multiple of 16
    m_ngrow = IntVect{static_cast<int>(std::ceil(ngrow/16.)) * 16};

    Box const& domain = geom.Domain();
    Box domain_grown = domain;
    for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
        if (geom.isPeriodic(idim)) {
            m_ngrow[idim] = 0;
        } else {
            m_ngrow[idim] = std::min(m_ngrow[idim], domain_grown.length(idim));
        }
    }
    domain_grown.grow(m_ngrow);
    Box bounding_box = (extend_domain_face) ? domain : domain_grown;
    bounding_box.surroundingNodes();

    BoxList cut_boxes;
    BoxList covered_boxes;

    const int nprocs = ParallelDescriptor::NProcs();
    const int iproc = ParallelDescriptor::MyProc();

    num_crse_opt = std::max(0,std::min(8,num_crse_opt));
    for (int clev = num_crse_opt; clev >= 0; --clev) {
        IntVect crse_ratio(1 << clev);
        if (domain.coarsenable(crse_ratio)) {
            Box const& crse_bounding_box = amrex::coarsen(bounding_box, crse_ratio);
            Geometry const& crse_geom = amrex::coarsen(geom, crse_ratio);
            BoxList test_boxes;
            if (cut_boxes.isEmpty()) {
                covered_boxes.clear();
                test_boxes = BoxList(crse_geom.Domain());
                test_boxes.maxSize(max_grid_size);
            } else {
                test_boxes.swap(cut_boxes);
                test_boxes.coarsen(crse_ratio);
                test_boxes.maxSize(max_grid_size);
            }

            const Long nboxes = test_boxes.size();
            const auto& boxes = test_boxes.data();
            for (Long i = iproc; i < nboxes; i += nprocs) {
                const Box& vbx = boxes[i];
                const Box& gbx = amrex::surroundingNodes(amrex::grow(vbx,1));
                auto box_type = gshop.getBoxType(gbx&crse_bounding_box,crse_geom,RunOn::Gpu);
                if (box_type == gshop.allcovered) {
                    covered_boxes.push_back(amrex::refine(vbx, crse_ratio));
                } else if (box_type == gshop.mixedcells) {
                    cut_boxes.push_back(amrex::refine(vbx, crse_ratio));
                }
            }

            amrex::AllGatherBoxes(cut_boxes.data());
        }
    }

    amrex::AllGatherBoxes(covered_boxes.data());

    if (m_ngrow != 0) {
        auto grow_at_domain_boundary = [&] (BoxList& bl)
        {
            const IntVect& domlo = domain.smallEnd();
            const IntVect& domhi = domain.bigEnd();
            for (auto& b : bl) {
                for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
                    if (m_ngrow[idim] != 0) {
                        if (b.smallEnd(idim) == domlo[idim]) {
                            b.growLo(idim,m_ngrow[idim]);
                        }
                        if (b.bigEnd(idim) == domhi[idim]) {
                            b.growHi(idim,m_ngrow[idim]);
                        }
                    }
                }
            }
        };
        grow_at_domain_boundary(covered_boxes);
        grow_at_domain_boundary(cut_boxes);
    }

    if ( cut_boxes.isEmpty() &&
        !covered_boxes.isEmpty())
    {
        amrex::Abort("AMReX_EB2_Level.H: Domain is completely covered");
    }

    if (!covered_boxes.isEmpty()) {
        if (num_crse_opt > 2) { // don't want the box too big
            covered_boxes.maxSize(max_grid_size*4);
        }
        m_covered_grids = BoxArray(std::move(covered_boxes));
    }

    if (cut_boxes.isEmpty()) {
        m_grids = BoxArray();
        m_dmap = DistributionMapping();
        m_allregular = true;
        m_ok = true;
        return;
    }

    m_grids = BoxArray(std::move(cut_boxes));
    m_dmap = DistributionMapping(m_grids);

    m_mgf.define(m_grids, m_dmap);
    const int ng = GFab::ng;
    MFInfo mf_info;
    mf_info.SetTag("EB2::Level");
    m_cellflag.define(m_grids, m_dmap, 1, ng, mf_info);
    m_volfrac.define(m_grids, m_dmap, 1, ng, mf_info);
    m_centroid.define(m_grids, m_dmap, AMREX_SPACEDIM, ng, mf_info);
    m_bndryarea.define(m_grids, m_dmap, 1, ng, mf_info);
    m_bndrycent.define(m_grids, m_dmap, AMREX_SPACEDIM, ng, mf_info);
    m_bndrynorm.define(m_grids, m_dmap, AMREX_SPACEDIM, ng, mf_info);
    for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
        m_areafrac[idim].define(amrex::convert(m_grids, IntVect::TheDimensionVector(idim)),
                                m_dmap, 1, ng, mf_info);
        m_facecent[idim].define(amrex::convert(m_grids, IntVect::TheDimensionVector(idim)),
                                m_dmap, AMREX_SPACEDIM-1, ng, mf_info);
        IntVect edge_type{1}; edge_type[idim] = 0;
        m_edgecent[idim].define(amrex::convert(m_grids, edge_type), m_dmap, 1, ng, mf_info);
    }

    const auto dx = geom.CellSizeArray();
    const auto problo = geom.ProbLoArray();

    for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
        if (!extend_domain_face || geom.isPeriodic(idim)) {
            bounding_box.grow(idim,GFab::ng);
        }
    }

    RunOn gshop_run_on = (Gpu::inLaunchRegion() && gshop.isGPUable())
        ? RunOn::Gpu : RunOn::Cpu;

    bool hybrid = Gpu::inLaunchRegion() && (gshop_run_on == RunOn::Cpu);

    int iter = 0;
    for (; iter < maxiter; ++iter)
    {
        int nsmallcells = 0;
        int nmulticuts = 0;
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion()) reduction(+:nsmallcells,nmulticuts)
#endif
        {
#if (AMREX_SPACEDIM == 3)
            Array<BaseFab<Real>, AMREX_SPACEDIM> M2;
            EBCellFlagFab cellflagtmp;
#endif
            for (MFIter mfi(m_mgf); mfi.isValid(); ++mfi)
            {
                auto& gfab = m_mgf[mfi];
                const Box& vbx = gfab.validbox();

                auto& levelset = gfab.getLevelSet();
                if (iter == 0) {
                    gshop.fillFab(levelset, geom, gshop_run_on, bounding_box);
                    if (hybrid) {
                        levelset.prefetchToDevice();
                    }
                }

                auto& cellflag = m_cellflag[mfi];

                gfab.buildTypes(cellflag);

                Array4<Real const> const& clst = levelset.const_array();
                Array4<Real      > const&  lst = levelset.array();
                Array4<EBCellFlag> const& cfg = m_cellflag.array(mfi);
                Array4<Real> const& vfr = m_volfrac.array(mfi);
                Array4<Real> const& ctr = m_centroid.array(mfi);
                Array4<Real> const& bar = m_bndryarea.array(mfi);
                Array4<Real> const& bct = m_bndrycent.array(mfi);
                Array4<Real> const& bnm = m_bndrynorm.array(mfi);
                AMREX_D_TERM(Array4<Real> const& apx = m_areafrac[0].array(mfi);,
                             Array4<Real> const& apy = m_areafrac[1].array(mfi);,
                             Array4<Real> const& apz = m_areafrac[2].array(mfi););
                AMREX_D_TERM(Array4<Real> const& fcx = m_facecent[0].array(mfi);,
                             Array4<Real> const& fcy = m_facecent[1].array(mfi);,
                             Array4<Real> const& fcz = m_facecent[2].array(mfi););

                auto& facetype = gfab.getFaceType();
                AMREX_D_TERM(Array4<Type_t> const& ftx = facetype[0].array();,
                             Array4<Type_t> const& fty = facetype[1].array();,
                             Array4<Type_t> const& ftz = facetype[2].array(););

                int nmc = 0;
                int nsm = 0;

#if (AMREX_SPACEDIM == 3)
                auto& edgetype = gfab.getEdgeType();
                Array4<Type_t const> const& xdg = edgetype[0].const_array();
                Array4<Type_t const> const& ydg = edgetype[1].const_array();
                Array4<Type_t const> const& zdg = edgetype[2].const_array();

                Array4<Real> const& xip = m_edgecent[0].array(mfi);
                Array4<Real> const& yip = m_edgecent[1].array(mfi);
                Array4<Real> const& zip = m_edgecent[2].array(mfi);

                if (iter == 0) {
                    if (hybrid) {
                        Gpu::streamSynchronize();
                        for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
                            edgetype[idim].prefetchToHost();
                            m_edgecent[idim][mfi].prefetchToHost();
                        }
                    }

                    gshop.getIntercept({xip,yip,zip}, {xdg,ydg,zdg}, clst,
                                       geom, gshop_run_on, bounding_box);

                    if (hybrid) {
                        for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
                            edgetype[idim].prefetchToDevice();
                            m_edgecent[idim][mfi].prefetchToDevice();
                        }
                    }
                } else {
                    gshop.updateIntercept({xip,yip,zip}, {xdg,ydg,zdg}, clst, geom);
                }

                for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
                    const Box& b = facetype[idim].box();
                    M2[idim].resize(b,3);
                }
                Array4<Real> const& xm2 = M2[0].array();
                Array4<Real> const& ym2 = M2[1].array();
                Array4<Real> const& zm2 = M2[2].array();

                nmc = build_faces(vbx, cfg, ftx, fty, ftz, xdg, ydg, zdg, lst,
                                  xip, yip, zip, apx, apy, apz, fcx, fcy, fcz,
                                  xm2, ym2, zm2, dx, problo, cover_multiple_cuts);

                cellflagtmp.resize(m_cellflag[mfi].box());
                Elixir cellflagtmp_eli = cellflagtmp.elixir();
                Array4<EBCellFlag> const& cfgtmp = cellflagtmp.array();

                build_cells(vbx, cfg, ftx, fty, ftz, apx, apy, apz,
                            fcx, fcy, fcz, xm2, ym2, zm2, vfr, ctr,
                            bar, bct, bnm, cfgtmp, lst,
                            small_volfrac, geom, extend_domain_face, cover_multiple_cuts,
                            nsm, nmc);

                // Becasue it is used in a synchronous reduction kernel in
                // build_cells, we do not need to worry about M2's lifetime.
                // But we still need to use Elixir to extend the life of
                // cellflagtmp.

#elif (AMREX_SPACEDIM == 2)
                Array4<Real> const& xip = m_edgecent[0].array(mfi);
                Array4<Real> const& yip = m_edgecent[1].array(mfi);

                if (iter == 0) {
                    if (hybrid) {
                        Gpu::streamSynchronize();
                        for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
                            facetype[idim].prefetchToHost();
                            m_edgecent[idim][mfi].prefetchToHost();
                        }
                    }

                    //                         yes, factype[1] and then [0]
                    gshop.getIntercept({xip,yip},
                                       {facetype[1].const_array(), facetype[0].const_array()},
                                       clst, geom, gshop_run_on, bounding_box);

                    if (hybrid) {
                        for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
                            facetype[idim].prefetchToDevice();
                            m_edgecent[idim][mfi].prefetchToDevice();
                        }
                    }
                } else {
                    gshop.updateIntercept({xip,yip},
                                          {facetype[1].const_array(), facetype[0].const_array()},
                                          clst, geom);
                }

                nmc = build_faces(vbx, cfg, ftx, fty, clst, xip, yip, apx, apy, fcx, fcy,
                                  dx, problo, cover_multiple_cuts);

                build_cells(vbx, cfg, ftx, fty, apx, apy, vfr, ctr,
                            bar, bct, bnm, lst, small_volfrac, geom, extend_domain_face,
                            nsm, nmc);
#endif
                nsmallcells += nsm;
                nmulticuts  += nmc;
            }
        }

        ParallelAllReduce::Sum<int>({nsmallcells,nmulticuts}, ParallelContext::CommunicatorSub());
        if (nsmallcells == 0 && nmulticuts == 0) {
            break;
        } else {
            auto ls = m_mgf.getLevelSet();
            // This is an alias MulitFab, therefore FillBoundary on it is fine.
            ls.FillBoundary(geom.periodicity());
            if (amrex::Verbose() > 0) {
                if (nsmallcells) {
                    amrex::Print() << "AMReX EB: Iter. " << iter+1 << " fixed " << nsmallcells
                                   << " small cells" << std::endl;
                }
                if (nmulticuts) {
                    amrex::Print() << "AMReX EB: Iter. " << iter+1 << " fixed " << nmulticuts
                                   << " multicuts" << std::endl;
                }
            }
        }
    }

    AMREX_ALWAYS_ASSERT_WITH_MESSAGE(iter < maxiter, "EB: failed to fix small cells");

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(m_mgf); mfi.isValid(); ++mfi)
    {
        auto& gfab = m_mgf[mfi];
        auto const& levelset = gfab.getLevelSet();
        Array4<Real const> const& clst = levelset.const_array();

        AMREX_D_TERM(Array4<Real> const& xip = m_edgecent[0].array(mfi);,
                     Array4<Real> const& yip = m_edgecent[1].array(mfi);,
                     Array4<Real> const& zip = m_edgecent[2].array(mfi);)
#if (AMREX_SPACEDIM == 3)
        auto const& edgetype = gfab.getEdgeType();
        Array4<Type_t const> const& xdg = edgetype[0].const_array();
        Array4<Type_t const> const& ydg = edgetype[1].const_array();
        Array4<Type_t const> const& zdg = edgetype[2].const_array();

        intercept_to_edge_centroid(xip, yip, zip, xdg, ydg, zdg, clst, dx, problo);

#elif (AMREX_SPACEDIM == 2)
        auto& facetype = gfab.getFaceType();
        Array4<Type_t const> const& ftx = facetype[0].const_array();
        Array4<Type_t const> const& fty = facetype[1].const_array();
        //                                  fty then ftx
        intercept_to_edge_centroid(xip, yip, fty, ftx, clst, dx, problo);
#endif
    }

    m_levelset = m_mgf.getLevelSet();

    m_ok = true;
}